

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void run_eckey_edge_case_test(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  size_t len;
  unsigned_long _zzq_result_21;
  secp256k1_pubkey pubkey;
  uchar ctmp [33];
  secp256k1_pubkey *pubkeys [3];
  uchar ctmp2 [33];
  secp256k1_callback _saved_callback;
  secp256k1_pubkey pubkey2;
  uchar zeros [64];
  uchar orderc [32];
  secp256k1_pubkey pubkey_one;
  secp256k1_pubkey pubkey_negone;
  
  orderc[0x10] = 0xba;
  orderc[0x11] = 0xae;
  orderc[0x12] = 0xdc;
  orderc[0x13] = 0xe6;
  orderc[0x14] = 0xaf;
  orderc[0x15] = 'H';
  orderc[0x16] = 0xa0;
  orderc[0x17] = ';';
  orderc[0x18] = 0xbf;
  orderc[0x19] = 0xd2;
  orderc[0x1a] = '^';
  orderc[0x1b] = 0x8c;
  orderc[0x1c] = 0xd0;
  orderc[0x1d] = '6';
  orderc[0x1e] = 'A';
  orderc[0x1f] = 'A';
  orderc[0] = 0xff;
  orderc[1] = 0xff;
  orderc[2] = 0xff;
  orderc[3] = 0xff;
  orderc[4] = 0xff;
  orderc[5] = 0xff;
  orderc[6] = 0xff;
  orderc[7] = 0xff;
  orderc[8] = 0xff;
  orderc[9] = 0xff;
  orderc[10] = 0xff;
  orderc[0xb] = 0xff;
  orderc[0xc] = 0xff;
  orderc[0xd] = 0xff;
  orderc[0xe] = 0xff;
  orderc[0xf] = 0xfe;
  zeros[0x30] = '\0';
  zeros[0x31] = '\0';
  zeros[0x32] = '\0';
  zeros[0x33] = '\0';
  zeros[0x34] = '\0';
  zeros[0x35] = '\0';
  zeros[0x36] = '\0';
  zeros[0x37] = '\0';
  zeros[0x38] = '\0';
  zeros[0x39] = '\0';
  zeros[0x3a] = '\0';
  zeros[0x3b] = '\0';
  zeros[0x3c] = '\0';
  zeros[0x3d] = '\0';
  zeros[0x3e] = '\0';
  zeros[0x3f] = '\0';
  zeros[0x20] = '\0';
  zeros[0x21] = '\0';
  zeros[0x22] = '\0';
  zeros[0x23] = '\0';
  zeros[0x24] = '\0';
  zeros[0x25] = '\0';
  zeros[0x26] = '\0';
  zeros[0x27] = '\0';
  zeros[0x28] = '\0';
  zeros[0x29] = '\0';
  zeros[0x2a] = '\0';
  zeros[0x2b] = '\0';
  zeros[0x2c] = '\0';
  zeros[0x2d] = '\0';
  zeros[0x2e] = '\0';
  zeros[0x2f] = '\0';
  zeros[0x10] = '\0';
  zeros[0x11] = '\0';
  zeros[0x12] = '\0';
  zeros[0x13] = '\0';
  zeros[0x14] = '\0';
  zeros[0x15] = '\0';
  zeros[0x16] = '\0';
  zeros[0x17] = '\0';
  zeros[0x18] = '\0';
  zeros[0x19] = '\0';
  zeros[0x1a] = '\0';
  zeros[0x1b] = '\0';
  zeros[0x1c] = '\0';
  zeros[0x1d] = '\0';
  zeros[0x1e] = '\0';
  zeros[0x1f] = '\0';
  zeros[0] = '\0';
  zeros[1] = '\0';
  zeros[2] = '\0';
  zeros[3] = '\0';
  zeros[4] = '\0';
  zeros[5] = '\0';
  zeros[6] = '\0';
  zeros[7] = '\0';
  zeros[8] = '\0';
  zeros[9] = '\0';
  zeros[10] = '\0';
  zeros[0xb] = '\0';
  zeros[0xc] = '\0';
  zeros[0xd] = '\0';
  zeros[0xe] = '\0';
  zeros[0xf] = '\0';
  iVar8 = secp256k1_ec_seckey_verify(CTX,orderc);
  if (iVar8 == 0) {
    pubkey2.data[0] = '\x01';
    pubkey2.data[1] = '\0';
    pubkey2.data[2] = 'C';
    pubkey2.data[3] = 'M';
    pubkey2.data[4] = '\0';
    pubkey2.data[5] = '\0';
    pubkey2.data[6] = '\0';
    pubkey2.data[7] = '\0';
    pubkey2.data[0x10] = '@';
    pubkey2.data[0x11] = '\0';
    pubkey2.data[0x12] = '\0';
    pubkey2.data[0x13] = '\0';
    pubkey2.data[0x14] = '\0';
    pubkey2.data[0x15] = '\0';
    pubkey2.data[0x16] = '\0';
    pubkey2.data[0x17] = '\0';
    pubkey2.data[0x18] = '\0';
    pubkey2.data[0x19] = '\0';
    pubkey2.data[0x1a] = '\0';
    pubkey2.data[0x1b] = '\0';
    pubkey2.data[0x1c] = '\0';
    pubkey2.data[0x1d] = '\0';
    pubkey2.data[0x1e] = '\0';
    pubkey2.data[0x1f] = '\0';
    pubkey2.data[0x20] = '\0';
    pubkey2.data[0x21] = '\0';
    pubkey2.data[0x22] = '\0';
    pubkey2.data[0x23] = '\0';
    pubkey2.data[0x24] = '\0';
    pubkey2.data[0x25] = '\0';
    pubkey2.data[0x26] = '\0';
    pubkey2.data[0x27] = '\0';
    pubkey2.data[0x28] = '\0';
    pubkey2.data[0x29] = '\0';
    pubkey2.data[0x2a] = '\0';
    pubkey2.data[0x2b] = '\0';
    pubkey2.data[0x2c] = '\0';
    pubkey2.data[0x2d] = '\0';
    pubkey2.data[0x2e] = '\0';
    pubkey2.data[0x2f] = '\0';
    pubkey_one.data[0] = '\0';
    pubkey_one.data[1] = '\0';
    pubkey_one.data[2] = '\0';
    pubkey_one.data[3] = '\0';
    pubkey_one.data[4] = '\0';
    pubkey_one.data[5] = '\0';
    pubkey_one.data[6] = '\0';
    pubkey_one.data[7] = '\0';
    pubkey2.data._8_8_ = &pubkey;
    iVar8 = secp256k1_ec_pubkey_create(CTX,&pubkey,orderc);
    if (iVar8 == 0) {
      pubkey2.data[0] = '\x05';
      pubkey2.data[1] = '\0';
      pubkey2.data[2] = 'C';
      pubkey2.data[3] = 'M';
      pubkey2.data[4] = '\0';
      pubkey2.data[5] = '\0';
      pubkey2.data[6] = '\0';
      pubkey2.data[7] = '\0';
      pubkey2.data[0x10] = '@';
      pubkey2.data[0x11] = '\0';
      pubkey2.data[0x12] = '\0';
      pubkey2.data[0x13] = '\0';
      pubkey2.data[0x14] = '\0';
      pubkey2.data[0x15] = '\0';
      pubkey2.data[0x16] = '\0';
      pubkey2.data[0x17] = '\0';
      pubkey2.data[0x18] = '\0';
      pubkey2.data[0x19] = '\0';
      pubkey2.data[0x1a] = '\0';
      pubkey2.data[0x1b] = '\0';
      pubkey2.data[0x1c] = '\0';
      pubkey2.data[0x1d] = '\0';
      pubkey2.data[0x1e] = '\0';
      pubkey2.data[0x1f] = '\0';
      pubkey2.data[0x20] = '\0';
      pubkey2.data[0x21] = '\0';
      pubkey2.data[0x22] = '\0';
      pubkey2.data[0x23] = '\0';
      pubkey2.data[0x24] = '\0';
      pubkey2.data[0x25] = '\0';
      pubkey2.data[0x26] = '\0';
      pubkey2.data[0x27] = '\0';
      pubkey2.data[0x28] = '\0';
      pubkey2.data[0x29] = '\0';
      pubkey2.data[0x2a] = '\0';
      pubkey2.data[0x2b] = '\0';
      pubkey2.data[0x2c] = '\0';
      pubkey2.data[0x2d] = '\0';
      pubkey2.data[0x2e] = '\0';
      pubkey2.data[0x2f] = '\0';
      pubkey_one.data[0] = '\0';
      pubkey_one.data[1] = '\0';
      pubkey_one.data[2] = '\0';
      pubkey_one.data[3] = '\0';
      pubkey_one.data[4] = '\0';
      pubkey_one.data[5] = '\0';
      pubkey_one.data[6] = '\0';
      pubkey_one.data[7] = '\0';
      pubkey2.data._8_8_ = &pubkey;
      iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40);
      if (iVar8 == 0) {
        ctmp[0x18] = 0xff;
        ctmp[0x19] = 0xff;
        ctmp[0x1a] = 0xff;
        ctmp[0x1b] = 0xff;
        ctmp[0x10] = 0xff;
        ctmp[0x11] = 0xff;
        ctmp[0x12] = 0xff;
        ctmp[0x13] = 0xff;
        ctmp[0x14] = 0xff;
        ctmp[0x15] = 0xff;
        ctmp[0x16] = 0xff;
        ctmp[0x17] = 0xff;
        ctmp[0x1c] = 0xff;
        ctmp[0x1d] = 0xff;
        ctmp[0x1e] = 0xff;
        ctmp[0x1f] = 0xff;
        ctmp[8] = 0xff;
        ctmp[9] = 0xff;
        ctmp[10] = 0xff;
        ctmp[0xb] = 0xff;
        ctmp[0] = 0xff;
        ctmp[1] = 0xff;
        ctmp[2] = 0xff;
        ctmp[3] = 0xff;
        ctmp[4] = 0xff;
        ctmp[5] = 0xff;
        ctmp[6] = 0xff;
        ctmp[7] = 0xff;
        ctmp[0xc] = 0xff;
        ctmp[0xd] = 0xff;
        ctmp[0xe] = 0xff;
        ctmp[0xf] = 0xff;
        iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp);
        if (iVar8 == 0) {
          builtin_memcpy(pubkey.data + 0x30,
                         "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
          builtin_memcpy(pubkey.data + 0x20,
                         "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
          builtin_memcpy(pubkey.data + 0x10,
                         "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
          builtin_memcpy(pubkey.data,
                         "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
          pubkey2.data[0] = '\x01';
          pubkey2.data[1] = '\0';
          pubkey2.data[2] = 'C';
          pubkey2.data[3] = 'M';
          pubkey2.data[4] = '\0';
          pubkey2.data[5] = '\0';
          pubkey2.data[6] = '\0';
          pubkey2.data[7] = '\0';
          pubkey2.data[0x10] = '@';
          pubkey2.data[0x11] = '\0';
          pubkey2.data[0x12] = '\0';
          pubkey2.data[0x13] = '\0';
          pubkey2.data[0x14] = '\0';
          pubkey2.data[0x15] = '\0';
          pubkey2.data[0x16] = '\0';
          pubkey2.data[0x17] = '\0';
          pubkey2.data[0x18] = '\0';
          pubkey2.data[0x19] = '\0';
          pubkey2.data[0x1a] = '\0';
          pubkey2.data[0x1b] = '\0';
          pubkey2.data[0x1c] = '\0';
          pubkey2.data[0x1d] = '\0';
          pubkey2.data[0x1e] = '\0';
          pubkey2.data[0x1f] = '\0';
          pubkey2.data[0x20] = '\0';
          pubkey2.data[0x21] = '\0';
          pubkey2.data[0x22] = '\0';
          pubkey2.data[0x23] = '\0';
          pubkey2.data[0x24] = '\0';
          pubkey2.data[0x25] = '\0';
          pubkey2.data[0x26] = '\0';
          pubkey2.data[0x27] = '\0';
          pubkey2.data[0x28] = '\0';
          pubkey2.data[0x29] = '\0';
          pubkey2.data[0x2a] = '\0';
          pubkey2.data[0x2b] = '\0';
          pubkey2.data[0x2c] = '\0';
          pubkey2.data[0x2d] = '\0';
          pubkey2.data[0x2e] = '\0';
          pubkey2.data[0x2f] = '\0';
          pubkey_one.data[0] = '\0';
          pubkey_one.data[1] = '\0';
          pubkey_one.data[2] = '\0';
          pubkey_one.data[3] = '\0';
          pubkey_one.data[4] = '\0';
          pubkey_one.data[5] = '\0';
          pubkey_one.data[6] = '\0';
          pubkey_one.data[7] = '\0';
          pubkey2.data._8_8_ = &pubkey;
          iVar8 = secp256k1_ec_pubkey_create(CTX,&pubkey,ctmp);
          if (iVar8 == 0) {
            pubkey2.data[0] = '\x05';
            pubkey2.data[1] = '\0';
            pubkey2.data[2] = 'C';
            pubkey2.data[3] = 'M';
            pubkey2.data[4] = '\0';
            pubkey2.data[5] = '\0';
            pubkey2.data[6] = '\0';
            pubkey2.data[7] = '\0';
            pubkey2.data[0x10] = '@';
            pubkey2.data[0x11] = '\0';
            pubkey2.data[0x12] = '\0';
            pubkey2.data[0x13] = '\0';
            pubkey2.data[0x14] = '\0';
            pubkey2.data[0x15] = '\0';
            pubkey2.data[0x16] = '\0';
            pubkey2.data[0x17] = '\0';
            pubkey2.data[0x18] = '\0';
            pubkey2.data[0x19] = '\0';
            pubkey2.data[0x1a] = '\0';
            pubkey2.data[0x1b] = '\0';
            pubkey2.data[0x1c] = '\0';
            pubkey2.data[0x1d] = '\0';
            pubkey2.data[0x1e] = '\0';
            pubkey2.data[0x1f] = '\0';
            pubkey2.data[0x20] = '\0';
            pubkey2.data[0x21] = '\0';
            pubkey2.data[0x22] = '\0';
            pubkey2.data[0x23] = '\0';
            pubkey2.data[0x24] = '\0';
            pubkey2.data[0x25] = '\0';
            pubkey2.data[0x26] = '\0';
            pubkey2.data[0x27] = '\0';
            pubkey2.data[0x28] = '\0';
            pubkey2.data[0x29] = '\0';
            pubkey2.data[0x2a] = '\0';
            pubkey2.data[0x2b] = '\0';
            pubkey2.data[0x2c] = '\0';
            pubkey2.data[0x2d] = '\0';
            pubkey2.data[0x2e] = '\0';
            pubkey2.data[0x2f] = '\0';
            pubkey_one.data[0] = '\0';
            pubkey_one.data[1] = '\0';
            pubkey_one.data[2] = '\0';
            pubkey_one.data[3] = '\0';
            pubkey_one.data[4] = '\0';
            pubkey_one.data[5] = '\0';
            pubkey_one.data[6] = '\0';
            pubkey_one.data[7] = '\0';
            pubkey2.data._8_8_ = &pubkey;
            iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40);
            if (iVar8 == 0) {
              ctmp[0x10] = '\0';
              ctmp[0x11] = '\0';
              ctmp[0x12] = '\0';
              ctmp[0x13] = '\0';
              ctmp[0x14] = '\0';
              ctmp[0x15] = '\0';
              ctmp[0x16] = '\0';
              ctmp[0x17] = '\0';
              ctmp[0x18] = '\0';
              ctmp[0x19] = '\0';
              ctmp[0x1a] = '\0';
              ctmp[0x1b] = '\0';
              ctmp[0x1c] = '\0';
              ctmp[0x1d] = '\0';
              ctmp[0x1e] = '\0';
              ctmp[0x1f] = '\0';
              ctmp[0] = '\0';
              ctmp[1] = '\0';
              ctmp[2] = '\0';
              ctmp[3] = '\0';
              ctmp[4] = '\0';
              ctmp[5] = '\0';
              ctmp[6] = '\0';
              ctmp[7] = '\0';
              ctmp[8] = '\0';
              ctmp[9] = '\0';
              ctmp[10] = '\0';
              ctmp[0xb] = '\0';
              ctmp[0xc] = '\0';
              ctmp[0xd] = '\0';
              ctmp[0xe] = '\0';
              ctmp[0xf] = '\0';
              iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp);
              if (iVar8 == 0) {
                builtin_memcpy(pubkey.data + 0x30,
                               "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                               0x10);
                builtin_memcpy(pubkey.data + 0x20,
                               "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                               0x10);
                builtin_memcpy(pubkey.data + 0x10,
                               "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                               0x10);
                builtin_memcpy(pubkey.data,
                               "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                               0x10);
                pubkey2.data[0] = '\x01';
                pubkey2.data[1] = '\0';
                pubkey2.data[2] = 'C';
                pubkey2.data[3] = 'M';
                pubkey2.data[4] = '\0';
                pubkey2.data[5] = '\0';
                pubkey2.data[6] = '\0';
                pubkey2.data[7] = '\0';
                pubkey2.data[0x10] = '@';
                pubkey2.data[0x11] = '\0';
                pubkey2.data[0x12] = '\0';
                pubkey2.data[0x13] = '\0';
                pubkey2.data[0x14] = '\0';
                pubkey2.data[0x15] = '\0';
                pubkey2.data[0x16] = '\0';
                pubkey2.data[0x17] = '\0';
                pubkey2.data[0x18] = '\0';
                pubkey2.data[0x19] = '\0';
                pubkey2.data[0x1a] = '\0';
                pubkey2.data[0x1b] = '\0';
                pubkey2.data[0x1c] = '\0';
                pubkey2.data[0x1d] = '\0';
                pubkey2.data[0x1e] = '\0';
                pubkey2.data[0x1f] = '\0';
                pubkey2.data[0x20] = '\0';
                pubkey2.data[0x21] = '\0';
                pubkey2.data[0x22] = '\0';
                pubkey2.data[0x23] = '\0';
                pubkey2.data[0x24] = '\0';
                pubkey2.data[0x25] = '\0';
                pubkey2.data[0x26] = '\0';
                pubkey2.data[0x27] = '\0';
                pubkey2.data[0x28] = '\0';
                pubkey2.data[0x29] = '\0';
                pubkey2.data[0x2a] = '\0';
                pubkey2.data[0x2b] = '\0';
                pubkey2.data[0x2c] = '\0';
                pubkey2.data[0x2d] = '\0';
                pubkey2.data[0x2e] = '\0';
                pubkey2.data[0x2f] = '\0';
                pubkey_one.data[0] = '\0';
                pubkey_one.data[1] = '\0';
                pubkey_one.data[2] = '\0';
                pubkey_one.data[3] = '\0';
                pubkey_one.data[4] = '\0';
                pubkey_one.data[5] = '\0';
                pubkey_one.data[6] = '\0';
                pubkey_one.data[7] = '\0';
                pubkey2.data._8_8_ = &pubkey;
                iVar8 = secp256k1_ec_pubkey_create(CTX,&pubkey,ctmp);
                if (iVar8 == 0) {
                  pubkey2.data[0] = '\x05';
                  pubkey2.data[1] = '\0';
                  pubkey2.data[2] = 'C';
                  pubkey2.data[3] = 'M';
                  pubkey2.data[4] = '\0';
                  pubkey2.data[5] = '\0';
                  pubkey2.data[6] = '\0';
                  pubkey2.data[7] = '\0';
                  pubkey2.data[0x10] = '@';
                  pubkey2.data[0x11] = '\0';
                  pubkey2.data[0x12] = '\0';
                  pubkey2.data[0x13] = '\0';
                  pubkey2.data[0x14] = '\0';
                  pubkey2.data[0x15] = '\0';
                  pubkey2.data[0x16] = '\0';
                  pubkey2.data[0x17] = '\0';
                  pubkey2.data[0x18] = '\0';
                  pubkey2.data[0x19] = '\0';
                  pubkey2.data[0x1a] = '\0';
                  pubkey2.data[0x1b] = '\0';
                  pubkey2.data[0x1c] = '\0';
                  pubkey2.data[0x1d] = '\0';
                  pubkey2.data[0x1e] = '\0';
                  pubkey2.data[0x1f] = '\0';
                  pubkey2.data[0x20] = '\0';
                  pubkey2.data[0x21] = '\0';
                  pubkey2.data[0x22] = '\0';
                  pubkey2.data[0x23] = '\0';
                  pubkey2.data[0x24] = '\0';
                  pubkey2.data[0x25] = '\0';
                  pubkey2.data[0x26] = '\0';
                  pubkey2.data[0x27] = '\0';
                  pubkey2.data[0x28] = '\0';
                  pubkey2.data[0x29] = '\0';
                  pubkey2.data[0x2a] = '\0';
                  pubkey2.data[0x2b] = '\0';
                  pubkey2.data[0x2c] = '\0';
                  pubkey2.data[0x2d] = '\0';
                  pubkey2.data[0x2e] = '\0';
                  pubkey2.data[0x2f] = '\0';
                  pubkey_one.data[0] = '\0';
                  pubkey_one.data[1] = '\0';
                  pubkey_one.data[2] = '\0';
                  pubkey_one.data[3] = '\0';
                  pubkey_one.data[4] = '\0';
                  pubkey_one.data[5] = '\0';
                  pubkey_one.data[6] = '\0';
                  pubkey_one.data[7] = '\0';
                  pubkey2.data._8_8_ = &pubkey;
                  iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40);
                  if (iVar8 == 0) {
                    ctmp[0x1f] = '\x01';
                    iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp);
                    if (iVar8 == 0) {
                      pcVar10 = "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 1";
                      uVar9 = 0x17a8;
                    }
                    else {
                      pubkey.data[0x30] = '\0';
                      pubkey.data[0x31] = '\0';
                      pubkey.data[0x32] = '\0';
                      pubkey.data[0x33] = '\0';
                      pubkey.data[0x34] = '\0';
                      pubkey.data[0x35] = '\0';
                      pubkey.data[0x36] = '\0';
                      pubkey.data[0x37] = '\0';
                      pubkey.data[0x38] = '\0';
                      pubkey.data[0x39] = '\0';
                      pubkey.data[0x3a] = '\0';
                      pubkey.data[0x3b] = '\0';
                      pubkey.data[0x3c] = '\0';
                      pubkey.data[0x3d] = '\0';
                      pubkey.data[0x3e] = '\0';
                      pubkey.data[0x3f] = '\0';
                      pubkey.data[0x20] = '\0';
                      pubkey.data[0x21] = '\0';
                      pubkey.data[0x22] = '\0';
                      pubkey.data[0x23] = '\0';
                      pubkey.data[0x24] = '\0';
                      pubkey.data[0x25] = '\0';
                      pubkey.data[0x26] = '\0';
                      pubkey.data[0x27] = '\0';
                      pubkey.data[0x28] = '\0';
                      pubkey.data[0x29] = '\0';
                      pubkey.data[0x2a] = '\0';
                      pubkey.data[0x2b] = '\0';
                      pubkey.data[0x2c] = '\0';
                      pubkey.data[0x2d] = '\0';
                      pubkey.data[0x2e] = '\0';
                      pubkey.data[0x2f] = '\0';
                      pubkey.data[0x10] = '\0';
                      pubkey.data[0x11] = '\0';
                      pubkey.data[0x12] = '\0';
                      pubkey.data[0x13] = '\0';
                      pubkey.data[0x14] = '\0';
                      pubkey.data[0x15] = '\0';
                      pubkey.data[0x16] = '\0';
                      pubkey.data[0x17] = '\0';
                      pubkey.data[0x18] = '\0';
                      pubkey.data[0x19] = '\0';
                      pubkey.data[0x1a] = '\0';
                      pubkey.data[0x1b] = '\0';
                      pubkey.data[0x1c] = '\0';
                      pubkey.data[0x1d] = '\0';
                      pubkey.data[0x1e] = '\0';
                      pubkey.data[0x1f] = '\0';
                      pubkey.data[0] = '\0';
                      pubkey.data[1] = '\0';
                      pubkey.data[2] = '\0';
                      pubkey.data[3] = '\0';
                      pubkey.data[4] = '\0';
                      pubkey.data[5] = '\0';
                      pubkey.data[6] = '\0';
                      pubkey.data[7] = '\0';
                      pubkey.data[8] = '\0';
                      pubkey.data[9] = '\0';
                      pubkey.data[10] = '\0';
                      pubkey.data[0xb] = '\0';
                      pubkey.data[0xc] = '\0';
                      pubkey.data[0xd] = '\0';
                      pubkey.data[0xe] = '\0';
                      pubkey.data[0xf] = '\0';
                      pubkey2.data[0] = '\x01';
                      pubkey2.data[1] = '\0';
                      pubkey2.data[2] = 'C';
                      pubkey2.data[3] = 'M';
                      pubkey2.data[4] = '\0';
                      pubkey2.data[5] = '\0';
                      pubkey2.data[6] = '\0';
                      pubkey2.data[7] = '\0';
                      pubkey2.data[0x10] = '@';
                      pubkey2.data[0x11] = '\0';
                      pubkey2.data[0x12] = '\0';
                      pubkey2.data[0x13] = '\0';
                      pubkey2.data[0x14] = '\0';
                      pubkey2.data[0x15] = '\0';
                      pubkey2.data[0x16] = '\0';
                      pubkey2.data[0x17] = '\0';
                      pubkey2.data[0x18] = '\0';
                      pubkey2.data[0x19] = '\0';
                      pubkey2.data[0x1a] = '\0';
                      pubkey2.data[0x1b] = '\0';
                      pubkey2.data[0x1c] = '\0';
                      pubkey2.data[0x1d] = '\0';
                      pubkey2.data[0x1e] = '\0';
                      pubkey2.data[0x1f] = '\0';
                      pubkey2.data[0x20] = '\0';
                      pubkey2.data[0x21] = '\0';
                      pubkey2.data[0x22] = '\0';
                      pubkey2.data[0x23] = '\0';
                      pubkey2.data[0x24] = '\0';
                      pubkey2.data[0x25] = '\0';
                      pubkey2.data[0x26] = '\0';
                      pubkey2.data[0x27] = '\0';
                      pubkey2.data[0x28] = '\0';
                      pubkey2.data[0x29] = '\0';
                      pubkey2.data[0x2a] = '\0';
                      pubkey2.data[0x2b] = '\0';
                      pubkey2.data[0x2c] = '\0';
                      pubkey2.data[0x2d] = '\0';
                      pubkey2.data[0x2e] = '\0';
                      pubkey2.data[0x2f] = '\0';
                      pubkey_one.data[0] = '\0';
                      pubkey_one.data[1] = '\0';
                      pubkey_one.data[2] = '\0';
                      pubkey_one.data[3] = '\0';
                      pubkey_one.data[4] = '\0';
                      pubkey_one.data[5] = '\0';
                      pubkey_one.data[6] = '\0';
                      pubkey_one.data[7] = '\0';
                      pubkey2.data._8_8_ = &pubkey;
                      iVar8 = secp256k1_ec_pubkey_create(CTX,&pubkey,ctmp);
                      if (iVar8 == 0) {
                        pcVar10 = 
                        "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1"
                        ;
                        uVar9 = 0x17ab;
                      }
                      else {
                        pubkey2.data[0] = '\x05';
                        pubkey2.data[1] = '\0';
                        pubkey2.data[2] = 'C';
                        pubkey2.data[3] = 'M';
                        pubkey2.data[4] = '\0';
                        pubkey2.data[5] = '\0';
                        pubkey2.data[6] = '\0';
                        pubkey2.data[7] = '\0';
                        pubkey2.data[0x10] = '@';
                        pubkey2.data[0x11] = '\0';
                        pubkey2.data[0x12] = '\0';
                        pubkey2.data[0x13] = '\0';
                        pubkey2.data[0x14] = '\0';
                        pubkey2.data[0x15] = '\0';
                        pubkey2.data[0x16] = '\0';
                        pubkey2.data[0x17] = '\0';
                        pubkey2.data[0x18] = '\0';
                        pubkey2.data[0x19] = '\0';
                        pubkey2.data[0x1a] = '\0';
                        pubkey2.data[0x1b] = '\0';
                        pubkey2.data[0x1c] = '\0';
                        pubkey2.data[0x1d] = '\0';
                        pubkey2.data[0x1e] = '\0';
                        pubkey2.data[0x1f] = '\0';
                        pubkey2.data[0x20] = '\0';
                        pubkey2.data[0x21] = '\0';
                        pubkey2.data[0x22] = '\0';
                        pubkey2.data[0x23] = '\0';
                        pubkey2.data[0x24] = '\0';
                        pubkey2.data[0x25] = '\0';
                        pubkey2.data[0x26] = '\0';
                        pubkey2.data[0x27] = '\0';
                        pubkey2.data[0x28] = '\0';
                        pubkey2.data[0x29] = '\0';
                        pubkey2.data[0x2a] = '\0';
                        pubkey2.data[0x2b] = '\0';
                        pubkey2.data[0x2c] = '\0';
                        pubkey2.data[0x2d] = '\0';
                        pubkey2.data[0x2e] = '\0';
                        pubkey2.data[0x2f] = '\0';
                        pubkey_one.data[0] = '\0';
                        pubkey_one.data[1] = '\0';
                        pubkey_one.data[2] = '\0';
                        pubkey_one.data[3] = '\0';
                        pubkey_one.data[4] = '\0';
                        pubkey_one.data[5] = '\0';
                        pubkey_one.data[6] = '\0';
                        pubkey_one.data[7] = '\0';
                        pubkey2.data._8_8_ = &pubkey;
                        iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40);
                        auVar7 = (undefined1  [16])pubkey.data._48_16_;
                        auVar6 = (undefined1  [16])pubkey.data._32_16_;
                        auVar5 = (undefined1  [16])pubkey.data._16_16_;
                        auVar4 = (undefined1  [16])pubkey.data._0_16_;
                        if (iVar8 < 1) {
                          pcVar10 = 
                          "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
                          ;
                          uVar9 = 0x17ad;
                        }
                        else {
                          pubkey_one.data[0x30] = pubkey.data[0x30];
                          pubkey_one.data[0x31] = pubkey.data[0x31];
                          pubkey_one.data[0x32] = pubkey.data[0x32];
                          pubkey_one.data[0x33] = pubkey.data[0x33];
                          pubkey_one.data[0x34] = pubkey.data[0x34];
                          pubkey_one.data[0x35] = pubkey.data[0x35];
                          pubkey_one.data[0x36] = pubkey.data[0x36];
                          pubkey_one.data[0x37] = pubkey.data[0x37];
                          pubkey_one.data[0x38] = pubkey.data[0x38];
                          pubkey_one.data[0x39] = pubkey.data[0x39];
                          pubkey_one.data[0x3a] = pubkey.data[0x3a];
                          pubkey_one.data[0x3b] = pubkey.data[0x3b];
                          pubkey_one.data[0x3c] = pubkey.data[0x3c];
                          pubkey_one.data[0x3d] = pubkey.data[0x3d];
                          pubkey_one.data[0x3e] = pubkey.data[0x3e];
                          pubkey_one.data[0x3f] = pubkey.data[0x3f];
                          pubkey_one.data[0x20] = pubkey.data[0x20];
                          pubkey_one.data[0x21] = pubkey.data[0x21];
                          pubkey_one.data[0x22] = pubkey.data[0x22];
                          pubkey_one.data[0x23] = pubkey.data[0x23];
                          pubkey_one.data[0x24] = pubkey.data[0x24];
                          pubkey_one.data[0x25] = pubkey.data[0x25];
                          pubkey_one.data[0x26] = pubkey.data[0x26];
                          pubkey_one.data[0x27] = pubkey.data[0x27];
                          pubkey_one.data[0x28] = pubkey.data[0x28];
                          pubkey_one.data[0x29] = pubkey.data[0x29];
                          pubkey_one.data[0x2a] = pubkey.data[0x2a];
                          pubkey_one.data[0x2b] = pubkey.data[0x2b];
                          pubkey_one.data[0x2c] = pubkey.data[0x2c];
                          pubkey_one.data[0x2d] = pubkey.data[0x2d];
                          pubkey_one.data[0x2e] = pubkey.data[0x2e];
                          pubkey_one.data[0x2f] = pubkey.data[0x2f];
                          pubkey_one.data[0x10] = pubkey.data[0x10];
                          pubkey_one.data[0x11] = pubkey.data[0x11];
                          pubkey_one.data[0x12] = pubkey.data[0x12];
                          pubkey_one.data[0x13] = pubkey.data[0x13];
                          pubkey_one.data[0x14] = pubkey.data[0x14];
                          pubkey_one.data[0x15] = pubkey.data[0x15];
                          pubkey_one.data[0x16] = pubkey.data[0x16];
                          pubkey_one.data[0x17] = pubkey.data[0x17];
                          pubkey_one.data[0x18] = pubkey.data[0x18];
                          pubkey_one.data[0x19] = pubkey.data[0x19];
                          pubkey_one.data[0x1a] = pubkey.data[0x1a];
                          pubkey_one.data[0x1b] = pubkey.data[0x1b];
                          pubkey_one.data[0x1c] = pubkey.data[0x1c];
                          pubkey_one.data[0x1d] = pubkey.data[0x1d];
                          pubkey_one.data[0x1e] = pubkey.data[0x1e];
                          pubkey_one.data[0x1f] = pubkey.data[0x1f];
                          pubkey_one.data[0] = pubkey.data[0];
                          pubkey_one.data[1] = pubkey.data[1];
                          pubkey_one.data[2] = pubkey.data[2];
                          pubkey_one.data[3] = pubkey.data[3];
                          pubkey_one.data[4] = pubkey.data[4];
                          pubkey_one.data[5] = pubkey.data[5];
                          pubkey_one.data[6] = pubkey.data[6];
                          pubkey_one.data[7] = pubkey.data[7];
                          pubkey_one.data[8] = pubkey.data[8];
                          pubkey_one.data[9] = pubkey.data[9];
                          pubkey_one.data[10] = pubkey.data[10];
                          pubkey_one.data[0xb] = pubkey.data[0xb];
                          pubkey_one.data[0xc] = pubkey.data[0xc];
                          pubkey_one.data[0xd] = pubkey.data[0xd];
                          pubkey_one.data[0xe] = pubkey.data[0xe];
                          pubkey_one.data[0xf] = pubkey.data[0xf];
                          ctmp[0x18] = orderc[0x18];
                          ctmp[0x19] = orderc[0x19];
                          ctmp[0x1a] = orderc[0x1a];
                          ctmp[0x1b] = orderc[0x1b];
                          ctmp[0x1c] = orderc[0x1c];
                          ctmp[0x1d] = orderc[0x1d];
                          ctmp[0x1e] = orderc[0x1e];
                          ctmp[0x1f] = orderc[0x1f];
                          ctmp[0x10] = orderc[0x10];
                          ctmp[0x11] = orderc[0x11];
                          ctmp[0x12] = orderc[0x12];
                          ctmp[0x13] = orderc[0x13];
                          ctmp[0x14] = orderc[0x14];
                          ctmp[0x15] = orderc[0x15];
                          ctmp[0x16] = orderc[0x16];
                          ctmp[0x17] = orderc[0x17];
                          ctmp[8] = orderc[8];
                          ctmp[9] = orderc[9];
                          ctmp[10] = orderc[10];
                          ctmp[0xb] = orderc[0xb];
                          ctmp[0xc] = orderc[0xc];
                          ctmp[0xd] = orderc[0xd];
                          ctmp[0xe] = orderc[0xe];
                          ctmp[0xf] = orderc[0xf];
                          ctmp[0] = orderc[0];
                          ctmp[1] = orderc[1];
                          ctmp[2] = orderc[2];
                          ctmp[3] = orderc[3];
                          ctmp[4] = orderc[4];
                          ctmp[5] = orderc[5];
                          ctmp[6] = orderc[6];
                          ctmp[7] = orderc[7];
                          ctmp[0x1f] = 'B';
                          pubkey.data._0_16_ = auVar4;
                          pubkey.data._16_16_ = auVar5;
                          pubkey.data._32_16_ = auVar6;
                          pubkey.data._48_16_ = auVar7;
                          iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp);
                          if (iVar8 == 0) {
                            builtin_memcpy(pubkey.data + 0x30,
                                           "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                           ,0x10);
                            builtin_memcpy(pubkey.data + 0x20,
                                           "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                           ,0x10);
                            builtin_memcpy(pubkey.data + 0x10,
                                           "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                           ,0x10);
                            builtin_memcpy(pubkey.data,
                                           "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                           ,0x10);
                            pubkey2.data[0] = '\x01';
                            pubkey2.data[1] = '\0';
                            pubkey2.data[2] = 'C';
                            pubkey2.data[3] = 'M';
                            pubkey2.data[4] = '\0';
                            pubkey2.data[5] = '\0';
                            pubkey2.data[6] = '\0';
                            pubkey2.data[7] = '\0';
                            pubkey2.data[0x10] = '@';
                            pubkey2.data[0x11] = '\0';
                            pubkey2.data[0x12] = '\0';
                            pubkey2.data[0x13] = '\0';
                            pubkey2.data[0x14] = '\0';
                            pubkey2.data[0x15] = '\0';
                            pubkey2.data[0x16] = '\0';
                            pubkey2.data[0x17] = '\0';
                            pubkey2.data[0x18] = '\0';
                            pubkey2.data[0x19] = '\0';
                            pubkey2.data[0x1a] = '\0';
                            pubkey2.data[0x1b] = '\0';
                            pubkey2.data[0x1c] = '\0';
                            pubkey2.data[0x1d] = '\0';
                            pubkey2.data[0x1e] = '\0';
                            pubkey2.data[0x1f] = '\0';
                            pubkey2.data[0x20] = '\0';
                            pubkey2.data[0x21] = '\0';
                            pubkey2.data[0x22] = '\0';
                            pubkey2.data[0x23] = '\0';
                            pubkey2.data[0x24] = '\0';
                            pubkey2.data[0x25] = '\0';
                            pubkey2.data[0x26] = '\0';
                            pubkey2.data[0x27] = '\0';
                            pubkey2.data[0x28] = '\0';
                            pubkey2.data[0x29] = '\0';
                            pubkey2.data[0x2a] = '\0';
                            pubkey2.data[0x2b] = '\0';
                            pubkey2.data[0x2c] = '\0';
                            pubkey2.data[0x2d] = '\0';
                            pubkey2.data[0x2e] = '\0';
                            pubkey2.data[0x2f] = '\0';
                            pubkey_negone.data[0] = '\0';
                            pubkey_negone.data[1] = '\0';
                            pubkey_negone.data[2] = '\0';
                            pubkey_negone.data[3] = '\0';
                            pubkey_negone.data[4] = '\0';
                            pubkey_negone.data[5] = '\0';
                            pubkey_negone.data[6] = '\0';
                            pubkey_negone.data[7] = '\0';
                            pubkey2.data._8_8_ = &pubkey;
                            iVar8 = secp256k1_ec_pubkey_create(CTX,&pubkey,ctmp);
                            if (iVar8 == 0) {
                              pubkey2.data[0] = '\x05';
                              pubkey2.data[1] = '\0';
                              pubkey2.data[2] = 'C';
                              pubkey2.data[3] = 'M';
                              pubkey2.data[4] = '\0';
                              pubkey2.data[5] = '\0';
                              pubkey2.data[6] = '\0';
                              pubkey2.data[7] = '\0';
                              pubkey2.data[0x10] = '@';
                              pubkey2.data[0x11] = '\0';
                              pubkey2.data[0x12] = '\0';
                              pubkey2.data[0x13] = '\0';
                              pubkey2.data[0x14] = '\0';
                              pubkey2.data[0x15] = '\0';
                              pubkey2.data[0x16] = '\0';
                              pubkey2.data[0x17] = '\0';
                              pubkey2.data[0x18] = '\0';
                              pubkey2.data[0x19] = '\0';
                              pubkey2.data[0x1a] = '\0';
                              pubkey2.data[0x1b] = '\0';
                              pubkey2.data[0x1c] = '\0';
                              pubkey2.data[0x1d] = '\0';
                              pubkey2.data[0x1e] = '\0';
                              pubkey2.data[0x1f] = '\0';
                              pubkey2.data[0x20] = '\0';
                              pubkey2.data[0x21] = '\0';
                              pubkey2.data[0x22] = '\0';
                              pubkey2.data[0x23] = '\0';
                              pubkey2.data[0x24] = '\0';
                              pubkey2.data[0x25] = '\0';
                              pubkey2.data[0x26] = '\0';
                              pubkey2.data[0x27] = '\0';
                              pubkey2.data[0x28] = '\0';
                              pubkey2.data[0x29] = '\0';
                              pubkey2.data[0x2a] = '\0';
                              pubkey2.data[0x2b] = '\0';
                              pubkey2.data[0x2c] = '\0';
                              pubkey2.data[0x2d] = '\0';
                              pubkey2.data[0x2e] = '\0';
                              pubkey2.data[0x2f] = '\0';
                              pubkey_negone.data[0] = '\0';
                              pubkey_negone.data[1] = '\0';
                              pubkey_negone.data[2] = '\0';
                              pubkey_negone.data[3] = '\0';
                              pubkey_negone.data[4] = '\0';
                              pubkey_negone.data[5] = '\0';
                              pubkey_negone.data[6] = '\0';
                              pubkey_negone.data[7] = '\0';
                              pubkey2.data._8_8_ = &pubkey;
                              iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40);
                              if (iVar8 == 0) {
                                ctmp[0x1f] = '@';
                                iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp);
                                if (iVar8 == 0) {
                                  pcVar10 = 
                                  "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 1"
                                  ;
                                  uVar9 = 0x17ba;
                                }
                                else {
                                  pubkey.data[0x30] = '\0';
                                  pubkey.data[0x31] = '\0';
                                  pubkey.data[0x32] = '\0';
                                  pubkey.data[0x33] = '\0';
                                  pubkey.data[0x34] = '\0';
                                  pubkey.data[0x35] = '\0';
                                  pubkey.data[0x36] = '\0';
                                  pubkey.data[0x37] = '\0';
                                  pubkey.data[0x38] = '\0';
                                  pubkey.data[0x39] = '\0';
                                  pubkey.data[0x3a] = '\0';
                                  pubkey.data[0x3b] = '\0';
                                  pubkey.data[0x3c] = '\0';
                                  pubkey.data[0x3d] = '\0';
                                  pubkey.data[0x3e] = '\0';
                                  pubkey.data[0x3f] = '\0';
                                  pubkey.data[0x20] = '\0';
                                  pubkey.data[0x21] = '\0';
                                  pubkey.data[0x22] = '\0';
                                  pubkey.data[0x23] = '\0';
                                  pubkey.data[0x24] = '\0';
                                  pubkey.data[0x25] = '\0';
                                  pubkey.data[0x26] = '\0';
                                  pubkey.data[0x27] = '\0';
                                  pubkey.data[0x28] = '\0';
                                  pubkey.data[0x29] = '\0';
                                  pubkey.data[0x2a] = '\0';
                                  pubkey.data[0x2b] = '\0';
                                  pubkey.data[0x2c] = '\0';
                                  pubkey.data[0x2d] = '\0';
                                  pubkey.data[0x2e] = '\0';
                                  pubkey.data[0x2f] = '\0';
                                  pubkey.data[0x10] = '\0';
                                  pubkey.data[0x11] = '\0';
                                  pubkey.data[0x12] = '\0';
                                  pubkey.data[0x13] = '\0';
                                  pubkey.data[0x14] = '\0';
                                  pubkey.data[0x15] = '\0';
                                  pubkey.data[0x16] = '\0';
                                  pubkey.data[0x17] = '\0';
                                  pubkey.data[0x18] = '\0';
                                  pubkey.data[0x19] = '\0';
                                  pubkey.data[0x1a] = '\0';
                                  pubkey.data[0x1b] = '\0';
                                  pubkey.data[0x1c] = '\0';
                                  pubkey.data[0x1d] = '\0';
                                  pubkey.data[0x1e] = '\0';
                                  pubkey.data[0x1f] = '\0';
                                  pubkey.data[0] = '\0';
                                  pubkey.data[1] = '\0';
                                  pubkey.data[2] = '\0';
                                  pubkey.data[3] = '\0';
                                  pubkey.data[4] = '\0';
                                  pubkey.data[5] = '\0';
                                  pubkey.data[6] = '\0';
                                  pubkey.data[7] = '\0';
                                  pubkey.data[8] = '\0';
                                  pubkey.data[9] = '\0';
                                  pubkey.data[10] = '\0';
                                  pubkey.data[0xb] = '\0';
                                  pubkey.data[0xc] = '\0';
                                  pubkey.data[0xd] = '\0';
                                  pubkey.data[0xe] = '\0';
                                  pubkey.data[0xf] = '\0';
                                  pubkey2.data[0] = '\x01';
                                  pubkey2.data[1] = '\0';
                                  pubkey2.data[2] = 'C';
                                  pubkey2.data[3] = 'M';
                                  pubkey2.data[4] = '\0';
                                  pubkey2.data[5] = '\0';
                                  pubkey2.data[6] = '\0';
                                  pubkey2.data[7] = '\0';
                                  pubkey2.data[0x10] = '@';
                                  pubkey2.data[0x11] = '\0';
                                  pubkey2.data[0x12] = '\0';
                                  pubkey2.data[0x13] = '\0';
                                  pubkey2.data[0x14] = '\0';
                                  pubkey2.data[0x15] = '\0';
                                  pubkey2.data[0x16] = '\0';
                                  pubkey2.data[0x17] = '\0';
                                  pubkey2.data[0x18] = '\0';
                                  pubkey2.data[0x19] = '\0';
                                  pubkey2.data[0x1a] = '\0';
                                  pubkey2.data[0x1b] = '\0';
                                  pubkey2.data[0x1c] = '\0';
                                  pubkey2.data[0x1d] = '\0';
                                  pubkey2.data[0x1e] = '\0';
                                  pubkey2.data[0x1f] = '\0';
                                  pubkey2.data[0x20] = '\0';
                                  pubkey2.data[0x21] = '\0';
                                  pubkey2.data[0x22] = '\0';
                                  pubkey2.data[0x23] = '\0';
                                  pubkey2.data[0x24] = '\0';
                                  pubkey2.data[0x25] = '\0';
                                  pubkey2.data[0x26] = '\0';
                                  pubkey2.data[0x27] = '\0';
                                  pubkey2.data[0x28] = '\0';
                                  pubkey2.data[0x29] = '\0';
                                  pubkey2.data[0x2a] = '\0';
                                  pubkey2.data[0x2b] = '\0';
                                  pubkey2.data[0x2c] = '\0';
                                  pubkey2.data[0x2d] = '\0';
                                  pubkey2.data[0x2e] = '\0';
                                  pubkey2.data[0x2f] = '\0';
                                  pubkey_negone.data[0] = '\0';
                                  pubkey_negone.data[1] = '\0';
                                  pubkey_negone.data[2] = '\0';
                                  pubkey_negone.data[3] = '\0';
                                  pubkey_negone.data[4] = '\0';
                                  pubkey_negone.data[5] = '\0';
                                  pubkey_negone.data[6] = '\0';
                                  pubkey_negone.data[7] = '\0';
                                  pubkey2.data._8_8_ = &pubkey;
                                  iVar8 = secp256k1_ec_pubkey_create(CTX,&pubkey,ctmp);
                                  if (iVar8 == 0) {
                                    pcVar10 = 
                                    "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1"
                                    ;
                                    uVar9 = 0x17bd;
                                  }
                                  else {
                                    pubkey2.data[0] = '\x05';
                                    pubkey2.data[1] = '\0';
                                    pubkey2.data[2] = 'C';
                                    pubkey2.data[3] = 'M';
                                    pubkey2.data[4] = '\0';
                                    pubkey2.data[5] = '\0';
                                    pubkey2.data[6] = '\0';
                                    pubkey2.data[7] = '\0';
                                    pubkey2.data[0x10] = '@';
                                    pubkey2.data[0x11] = '\0';
                                    pubkey2.data[0x12] = '\0';
                                    pubkey2.data[0x13] = '\0';
                                    pubkey2.data[0x14] = '\0';
                                    pubkey2.data[0x15] = '\0';
                                    pubkey2.data[0x16] = '\0';
                                    pubkey2.data[0x17] = '\0';
                                    pubkey2.data[0x18] = '\0';
                                    pubkey2.data[0x19] = '\0';
                                    pubkey2.data[0x1a] = '\0';
                                    pubkey2.data[0x1b] = '\0';
                                    pubkey2.data[0x1c] = '\0';
                                    pubkey2.data[0x1d] = '\0';
                                    pubkey2.data[0x1e] = '\0';
                                    pubkey2.data[0x1f] = '\0';
                                    pubkey2.data[0x20] = '\0';
                                    pubkey2.data[0x21] = '\0';
                                    pubkey2.data[0x22] = '\0';
                                    pubkey2.data[0x23] = '\0';
                                    pubkey2.data[0x24] = '\0';
                                    pubkey2.data[0x25] = '\0';
                                    pubkey2.data[0x26] = '\0';
                                    pubkey2.data[0x27] = '\0';
                                    pubkey2.data[0x28] = '\0';
                                    pubkey2.data[0x29] = '\0';
                                    pubkey2.data[0x2a] = '\0';
                                    pubkey2.data[0x2b] = '\0';
                                    pubkey2.data[0x2c] = '\0';
                                    pubkey2.data[0x2d] = '\0';
                                    pubkey2.data[0x2e] = '\0';
                                    pubkey2.data[0x2f] = '\0';
                                    pubkey_negone.data[0] = '\0';
                                    pubkey_negone.data[1] = '\0';
                                    pubkey_negone.data[2] = '\0';
                                    pubkey_negone.data[3] = '\0';
                                    pubkey_negone.data[4] = '\0';
                                    pubkey_negone.data[5] = '\0';
                                    pubkey_negone.data[6] = '\0';
                                    pubkey_negone.data[7] = '\0';
                                    pubkey2.data._8_8_ = &pubkey;
                                    iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40);
                                    auVar7 = (undefined1  [16])pubkey.data._48_16_;
                                    auVar6 = (undefined1  [16])pubkey.data._32_16_;
                                    auVar5 = (undefined1  [16])pubkey.data._16_16_;
                                    auVar4 = (undefined1  [16])pubkey.data._0_16_;
                                    if (iVar8 < 1) {
                                      pcVar10 = 
                                      "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
                                      ;
                                      uVar9 = 0x17bf;
                                    }
                                    else {
                                      pubkey_negone.data[0x30] = pubkey.data[0x30];
                                      pubkey_negone.data[0x31] = pubkey.data[0x31];
                                      pubkey_negone.data[0x32] = pubkey.data[0x32];
                                      pubkey_negone.data[0x33] = pubkey.data[0x33];
                                      pubkey_negone.data[0x34] = pubkey.data[0x34];
                                      pubkey_negone.data[0x35] = pubkey.data[0x35];
                                      pubkey_negone.data[0x36] = pubkey.data[0x36];
                                      pubkey_negone.data[0x37] = pubkey.data[0x37];
                                      pubkey_negone.data[0x38] = pubkey.data[0x38];
                                      pubkey_negone.data[0x39] = pubkey.data[0x39];
                                      pubkey_negone.data[0x3a] = pubkey.data[0x3a];
                                      pubkey_negone.data[0x3b] = pubkey.data[0x3b];
                                      pubkey_negone.data[0x3c] = pubkey.data[0x3c];
                                      pubkey_negone.data[0x3d] = pubkey.data[0x3d];
                                      pubkey_negone.data[0x3e] = pubkey.data[0x3e];
                                      pubkey_negone.data[0x3f] = pubkey.data[0x3f];
                                      pubkey_negone.data[0x20] = pubkey.data[0x20];
                                      pubkey_negone.data[0x21] = pubkey.data[0x21];
                                      pubkey_negone.data[0x22] = pubkey.data[0x22];
                                      pubkey_negone.data[0x23] = pubkey.data[0x23];
                                      pubkey_negone.data[0x24] = pubkey.data[0x24];
                                      pubkey_negone.data[0x25] = pubkey.data[0x25];
                                      pubkey_negone.data[0x26] = pubkey.data[0x26];
                                      pubkey_negone.data[0x27] = pubkey.data[0x27];
                                      pubkey_negone.data[0x28] = pubkey.data[0x28];
                                      pubkey_negone.data[0x29] = pubkey.data[0x29];
                                      pubkey_negone.data[0x2a] = pubkey.data[0x2a];
                                      pubkey_negone.data[0x2b] = pubkey.data[0x2b];
                                      pubkey_negone.data[0x2c] = pubkey.data[0x2c];
                                      pubkey_negone.data[0x2d] = pubkey.data[0x2d];
                                      pubkey_negone.data[0x2e] = pubkey.data[0x2e];
                                      pubkey_negone.data[0x2f] = pubkey.data[0x2f];
                                      pubkey_negone.data[0x10] = pubkey.data[0x10];
                                      pubkey_negone.data[0x11] = pubkey.data[0x11];
                                      pubkey_negone.data[0x12] = pubkey.data[0x12];
                                      pubkey_negone.data[0x13] = pubkey.data[0x13];
                                      pubkey_negone.data[0x14] = pubkey.data[0x14];
                                      pubkey_negone.data[0x15] = pubkey.data[0x15];
                                      pubkey_negone.data[0x16] = pubkey.data[0x16];
                                      pubkey_negone.data[0x17] = pubkey.data[0x17];
                                      pubkey_negone.data[0x18] = pubkey.data[0x18];
                                      pubkey_negone.data[0x19] = pubkey.data[0x19];
                                      pubkey_negone.data[0x1a] = pubkey.data[0x1a];
                                      pubkey_negone.data[0x1b] = pubkey.data[0x1b];
                                      pubkey_negone.data[0x1c] = pubkey.data[0x1c];
                                      pubkey_negone.data[0x1d] = pubkey.data[0x1d];
                                      pubkey_negone.data[0x1e] = pubkey.data[0x1e];
                                      pubkey_negone.data[0x1f] = pubkey.data[0x1f];
                                      pubkey_negone.data[0] = pubkey.data[0];
                                      pubkey_negone.data[1] = pubkey.data[1];
                                      pubkey_negone.data[2] = pubkey.data[2];
                                      pubkey_negone.data[3] = pubkey.data[3];
                                      pubkey_negone.data[4] = pubkey.data[4];
                                      pubkey_negone.data[5] = pubkey.data[5];
                                      pubkey_negone.data[6] = pubkey.data[6];
                                      pubkey_negone.data[7] = pubkey.data[7];
                                      pubkey_negone.data[8] = pubkey.data[8];
                                      pubkey_negone.data[9] = pubkey.data[9];
                                      pubkey_negone.data[10] = pubkey.data[10];
                                      pubkey_negone.data[0xb] = pubkey.data[0xb];
                                      pubkey_negone.data[0xc] = pubkey.data[0xc];
                                      pubkey_negone.data[0xd] = pubkey.data[0xd];
                                      pubkey_negone.data[0xe] = pubkey.data[0xe];
                                      pubkey_negone.data[0xf] = pubkey.data[0xf];
                                      ctmp2[0] = '\0';
                                      ctmp2[1] = '\0';
                                      ctmp2[2] = '\0';
                                      ctmp2[3] = '\0';
                                      ctmp2[4] = '\0';
                                      ctmp2[5] = '\0';
                                      ctmp2[6] = '\0';
                                      ctmp2[7] = '\0';
                                      ctmp2[8] = '\0';
                                      ctmp2[9] = '\0';
                                      ctmp2[10] = '\0';
                                      ctmp2[0xb] = '\0';
                                      ctmp2[0xc] = '\0';
                                      ctmp2[0xd] = '\0';
                                      ctmp2[0xe] = '\0';
                                      ctmp2[0xf] = '\0';
                                      ctmp2[0x10] = '\0';
                                      ctmp2[0x11] = '\0';
                                      ctmp2[0x12] = '\0';
                                      ctmp2[0x13] = '\0';
                                      ctmp2[0x14] = '\0';
                                      ctmp2[0x15] = '\0';
                                      ctmp2[0x16] = '\0';
                                      ctmp2[0x17] = '\0';
                                      ctmp2[0x18] = '\0';
                                      ctmp2[0x19] = '\0';
                                      ctmp2[0x1a] = '\0';
                                      ctmp2[0x1b] = '\0';
                                      ctmp2[0x1c] = '\0';
                                      ctmp2[0x1d] = '\0';
                                      ctmp2[0x1e] = '\0';
                                      ctmp2[0x1f] = '\0';
                                      pubkey.data._0_16_ = auVar4;
                                      pubkey.data._16_16_ = auVar5;
                                      pubkey.data._32_16_ = auVar6;
                                      pubkey.data._48_16_ = auVar7;
                                      iVar8 = secp256k1_ec_seckey_tweak_add(CTX,ctmp,ctmp2);
                                      if (iVar8 == 0) {
                                        pcVar10 = 
                                        "test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 1"
                                        ;
                                        uVar9 = 0x17c3;
                                      }
                                      else {
                                        iVar8 = secp256k1_memcmp_var(orderc,ctmp,0x1f);
                                        auVar7 = (undefined1  [16])pubkey.data._48_16_;
                                        auVar6 = (undefined1  [16])pubkey.data._32_16_;
                                        auVar5 = (undefined1  [16])pubkey.data._16_16_;
                                        auVar4 = (undefined1  [16])pubkey.data._0_16_;
                                        if ((iVar8 == 0) && (ctmp[0x1f] == '@')) {
                                          pubkey2.data[0x30] = pubkey.data[0x30];
                                          pubkey2.data[0x31] = pubkey.data[0x31];
                                          pubkey2.data[0x32] = pubkey.data[0x32];
                                          pubkey2.data[0x33] = pubkey.data[0x33];
                                          pubkey2.data[0x34] = pubkey.data[0x34];
                                          pubkey2.data[0x35] = pubkey.data[0x35];
                                          pubkey2.data[0x36] = pubkey.data[0x36];
                                          pubkey2.data[0x37] = pubkey.data[0x37];
                                          pubkey2.data[0x38] = pubkey.data[0x38];
                                          pubkey2.data[0x39] = pubkey.data[0x39];
                                          pubkey2.data[0x3a] = pubkey.data[0x3a];
                                          pubkey2.data[0x3b] = pubkey.data[0x3b];
                                          pubkey2.data[0x3c] = pubkey.data[0x3c];
                                          pubkey2.data[0x3d] = pubkey.data[0x3d];
                                          pubkey2.data[0x3e] = pubkey.data[0x3e];
                                          pubkey2.data[0x3f] = pubkey.data[0x3f];
                                          pubkey2.data[0x20] = pubkey.data[0x20];
                                          pubkey2.data[0x21] = pubkey.data[0x21];
                                          pubkey2.data[0x22] = pubkey.data[0x22];
                                          pubkey2.data[0x23] = pubkey.data[0x23];
                                          pubkey2.data[0x24] = pubkey.data[0x24];
                                          pubkey2.data[0x25] = pubkey.data[0x25];
                                          pubkey2.data[0x26] = pubkey.data[0x26];
                                          pubkey2.data[0x27] = pubkey.data[0x27];
                                          pubkey2.data[0x28] = pubkey.data[0x28];
                                          pubkey2.data[0x29] = pubkey.data[0x29];
                                          pubkey2.data[0x2a] = pubkey.data[0x2a];
                                          pubkey2.data[0x2b] = pubkey.data[0x2b];
                                          pubkey2.data[0x2c] = pubkey.data[0x2c];
                                          pubkey2.data[0x2d] = pubkey.data[0x2d];
                                          pubkey2.data[0x2e] = pubkey.data[0x2e];
                                          pubkey2.data[0x2f] = pubkey.data[0x2f];
                                          pubkey2.data[0x10] = pubkey.data[0x10];
                                          pubkey2.data[0x11] = pubkey.data[0x11];
                                          pubkey2.data[0x12] = pubkey.data[0x12];
                                          pubkey2.data[0x13] = pubkey.data[0x13];
                                          pubkey2.data[0x14] = pubkey.data[0x14];
                                          pubkey2.data[0x15] = pubkey.data[0x15];
                                          pubkey2.data[0x16] = pubkey.data[0x16];
                                          pubkey2.data[0x17] = pubkey.data[0x17];
                                          pubkey2.data[0x18] = pubkey.data[0x18];
                                          pubkey2.data[0x19] = pubkey.data[0x19];
                                          pubkey2.data[0x1a] = pubkey.data[0x1a];
                                          pubkey2.data[0x1b] = pubkey.data[0x1b];
                                          pubkey2.data[0x1c] = pubkey.data[0x1c];
                                          pubkey2.data[0x1d] = pubkey.data[0x1d];
                                          pubkey2.data[0x1e] = pubkey.data[0x1e];
                                          pubkey2.data[0x1f] = pubkey.data[0x1f];
                                          pubkey2.data[0] = pubkey.data[0];
                                          pubkey2.data[1] = pubkey.data[1];
                                          pubkey2.data[2] = pubkey.data[2];
                                          pubkey2.data[3] = pubkey.data[3];
                                          pubkey2.data[4] = pubkey.data[4];
                                          pubkey2.data[5] = pubkey.data[5];
                                          pubkey2.data[6] = pubkey.data[6];
                                          pubkey2.data[7] = pubkey.data[7];
                                          pubkey2.data[8] = pubkey.data[8];
                                          pubkey2.data[9] = pubkey.data[9];
                                          pubkey2.data[10] = pubkey.data[10];
                                          pubkey2.data[0xb] = pubkey.data[0xb];
                                          pubkey2.data[0xc] = pubkey.data[0xc];
                                          pubkey2.data[0xd] = pubkey.data[0xd];
                                          pubkey2.data[0xe] = pubkey.data[0xe];
                                          pubkey2.data[0xf] = pubkey.data[0xf];
                                          pubkey.data._0_16_ = auVar4;
                                          pubkey.data._16_16_ = auVar5;
                                          pubkey.data._32_16_ = auVar6;
                                          pubkey.data._48_16_ = auVar7;
                                          iVar8 = secp256k1_ec_pubkey_tweak_add(CTX,&pubkey,ctmp2);
                                          if (iVar8 == 0) {
                                            pcVar10 = 
                                            "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1"
                                            ;
                                            uVar9 = 0x17c6;
                                          }
                                          else {
                                            iVar8 = secp256k1_memcmp_var(&pubkey,&pubkey2,0x40);
                                            if (iVar8 == 0) {
                                              iVar8 = secp256k1_ec_seckey_tweak_mul(CTX,ctmp,ctmp2);
                                              if (iVar8 == 0) {
                                                iVar8 = secp256k1_memcmp_var(zeros,ctmp,0x20);
                                                if (iVar8 == 0) {
                                                  iVar8 = secp256k1_ec_pubkey_tweak_mul
                                                                    (CTX,&pubkey,ctmp2);
                                                  if (iVar8 == 0) {
                                                    iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40)
                                                    ;
                                                    if (iVar8 == 0) {
                                                      pubkey.data[0x38] = pubkey2.data[0x38];
                                                      pubkey.data[0x39] = pubkey2.data[0x39];
                                                      pubkey.data[0x3a] = pubkey2.data[0x3a];
                                                      pubkey.data[0x3b] = pubkey2.data[0x3b];
                                                      pubkey.data[0x3c] = pubkey2.data[0x3c];
                                                      pubkey.data[0x3d] = pubkey2.data[0x3d];
                                                      pubkey.data[0x3e] = pubkey2.data[0x3e];
                                                      pubkey.data[0x3f] = pubkey2.data[0x3f];
                                                      pubkey.data[0x30] = pubkey2.data[0x30];
                                                      pubkey.data[0x31] = pubkey2.data[0x31];
                                                      pubkey.data[0x32] = pubkey2.data[0x32];
                                                      pubkey.data[0x33] = pubkey2.data[0x33];
                                                      pubkey.data[0x34] = pubkey2.data[0x34];
                                                      pubkey.data[0x35] = pubkey2.data[0x35];
                                                      pubkey.data[0x36] = pubkey2.data[0x36];
                                                      pubkey.data[0x37] = pubkey2.data[0x37];
                                                      pubkey.data[0x28] = pubkey2.data[0x28];
                                                      pubkey.data[0x29] = pubkey2.data[0x29];
                                                      pubkey.data[0x2a] = pubkey2.data[0x2a];
                                                      pubkey.data[0x2b] = pubkey2.data[0x2b];
                                                      pubkey.data[0x2c] = pubkey2.data[0x2c];
                                                      pubkey.data[0x2d] = pubkey2.data[0x2d];
                                                      pubkey.data[0x2e] = pubkey2.data[0x2e];
                                                      pubkey.data[0x2f] = pubkey2.data[0x2f];
                                                      pubkey.data[0x20] = pubkey2.data[0x20];
                                                      pubkey.data[0x21] = pubkey2.data[0x21];
                                                      pubkey.data[0x22] = pubkey2.data[0x22];
                                                      pubkey.data[0x23] = pubkey2.data[0x23];
                                                      pubkey.data[0x24] = pubkey2.data[0x24];
                                                      pubkey.data[0x25] = pubkey2.data[0x25];
                                                      pubkey.data[0x26] = pubkey2.data[0x26];
                                                      pubkey.data[0x27] = pubkey2.data[0x27];
                                                      pubkey.data[0x18] = pubkey2.data[0x18];
                                                      pubkey.data[0x19] = pubkey2.data[0x19];
                                                      pubkey.data[0x1a] = pubkey2.data[0x1a];
                                                      pubkey.data[0x1b] = pubkey2.data[0x1b];
                                                      pubkey.data[0x1c] = pubkey2.data[0x1c];
                                                      pubkey.data[0x1d] = pubkey2.data[0x1d];
                                                      pubkey.data[0x1e] = pubkey2.data[0x1e];
                                                      pubkey.data[0x1f] = pubkey2.data[0x1f];
                                                      pubkey.data[0x10] = pubkey2.data[0x10];
                                                      pubkey.data[0x11] = pubkey2.data[0x11];
                                                      pubkey.data[0x12] = pubkey2.data[0x12];
                                                      pubkey.data[0x13] = pubkey2.data[0x13];
                                                      pubkey.data[0x14] = pubkey2.data[0x14];
                                                      pubkey.data[0x15] = pubkey2.data[0x15];
                                                      pubkey.data[0x16] = pubkey2.data[0x16];
                                                      pubkey.data[0x17] = pubkey2.data[0x17];
                                                      pubkey.data[8] = pubkey2.data[8];
                                                      pubkey.data[9] = pubkey2.data[9];
                                                      pubkey.data[10] = pubkey2.data[10];
                                                      pubkey.data[0xb] = pubkey2.data[0xb];
                                                      pubkey.data[0xc] = pubkey2.data[0xc];
                                                      pubkey.data[0xd] = pubkey2.data[0xd];
                                                      pubkey.data[0xe] = pubkey2.data[0xe];
                                                      pubkey.data[0xf] = pubkey2.data[0xf];
                                                      pubkey.data[0] = pubkey2.data[0];
                                                      pubkey.data[1] = pubkey2.data[1];
                                                      pubkey.data[2] = pubkey2.data[2];
                                                      pubkey.data[3] = pubkey2.data[3];
                                                      pubkey.data[4] = pubkey2.data[4];
                                                      pubkey.data[5] = pubkey2.data[5];
                                                      pubkey.data[6] = pubkey2.data[6];
                                                      pubkey.data[7] = pubkey2.data[7];
                                                      ctmp[8] = orderc[8];
                                                      ctmp[9] = orderc[9];
                                                      ctmp[10] = orderc[10];
                                                      ctmp[0xb] = orderc[0xb];
                                                      ctmp[0xc] = orderc[0xc];
                                                      ctmp[0xd] = orderc[0xd];
                                                      ctmp[0xe] = orderc[0xe];
                                                      ctmp[0xf] = orderc[0xf];
                                                      ctmp[0] = orderc[0];
                                                      ctmp[1] = orderc[1];
                                                      ctmp[2] = orderc[2];
                                                      ctmp[3] = orderc[3];
                                                      ctmp[4] = orderc[4];
                                                      ctmp[5] = orderc[5];
                                                      ctmp[6] = orderc[6];
                                                      ctmp[7] = orderc[7];
                                                      ctmp[0x18] = orderc[0x18];
                                                      ctmp[0x19] = orderc[0x19];
                                                      ctmp[0x1a] = orderc[0x1a];
                                                      ctmp[0x1b] = orderc[0x1b];
                                                      ctmp[0x1c] = orderc[0x1c];
                                                      ctmp[0x1d] = orderc[0x1d];
                                                      ctmp[0x1e] = orderc[0x1e];
                                                      ctmp[0x1f] = orderc[0x1f];
                                                      ctmp[0x10] = orderc[0x10];
                                                      ctmp[0x11] = orderc[0x11];
                                                      ctmp[0x12] = orderc[0x12];
                                                      ctmp[0x13] = orderc[0x13];
                                                      ctmp[0x14] = orderc[0x14];
                                                      ctmp[0x15] = orderc[0x15];
                                                      ctmp[0x16] = orderc[0x16];
                                                      ctmp[0x17] = orderc[0x17];
                                                      ctmp2[0] = '\0';
                                                      ctmp2[1] = '\0';
                                                      ctmp2[2] = '\0';
                                                      ctmp2[3] = '\0';
                                                      ctmp2[4] = '\0';
                                                      ctmp2[5] = '\0';
                                                      ctmp2[6] = '\0';
                                                      ctmp2[7] = '\0';
                                                      ctmp2[8] = '\0';
                                                      ctmp2[9] = '\0';
                                                      ctmp2[10] = '\0';
                                                      ctmp2[0xb] = '\0';
                                                      ctmp2[0xc] = '\0';
                                                      ctmp2[0xd] = '\0';
                                                      ctmp2[0xe] = '\0';
                                                      ctmp2[0xf] = '\0';
                                                      ctmp2._16_15_ =
                                                           SUB1615((undefined1  [16])0x0,0);
                                                      ctmp2[0x1f] = '\x01';
                                                      iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp2);
                                                      if (iVar8 == 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp2) == 1"
                                                  ;
                                                  uVar9 = 0x17d3;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_ec_seckey_verify(CTX,ctmp);
                                                    if (iVar8 == 0) {
                                                      iVar8 = secp256k1_ec_seckey_tweak_add
                                                                        (CTX,ctmp,ctmp2);
                                                      if (iVar8 == 0) {
                                                        iVar8 = secp256k1_memcmp_var
                                                                          (zeros,ctmp,0x20);
                                                        if (iVar8 == 0) {
                                                          ctmp[0x18] = orderc[0x18];
                                                          ctmp[0x19] = orderc[0x19];
                                                          ctmp[0x1a] = orderc[0x1a];
                                                          ctmp[0x1b] = orderc[0x1b];
                                                          ctmp[0x1c] = orderc[0x1c];
                                                          ctmp[0x1d] = orderc[0x1d];
                                                          ctmp[0x1e] = orderc[0x1e];
                                                          ctmp[0x1f] = orderc[0x1f];
                                                          ctmp[0x10] = orderc[0x10];
                                                          ctmp[0x11] = orderc[0x11];
                                                          ctmp[0x12] = orderc[0x12];
                                                          ctmp[0x13] = orderc[0x13];
                                                          ctmp[0x14] = orderc[0x14];
                                                          ctmp[0x15] = orderc[0x15];
                                                          ctmp[0x16] = orderc[0x16];
                                                          ctmp[0x17] = orderc[0x17];
                                                          ctmp[8] = orderc[8];
                                                          ctmp[9] = orderc[9];
                                                          ctmp[10] = orderc[10];
                                                          ctmp[0xb] = orderc[0xb];
                                                          ctmp[0xc] = orderc[0xc];
                                                          ctmp[0xd] = orderc[0xd];
                                                          ctmp[0xe] = orderc[0xe];
                                                          ctmp[0xf] = orderc[0xf];
                                                          ctmp[0] = orderc[0];
                                                          ctmp[1] = orderc[1];
                                                          ctmp[2] = orderc[2];
                                                          ctmp[3] = orderc[3];
                                                          ctmp[4] = orderc[4];
                                                          ctmp[5] = orderc[5];
                                                          ctmp[6] = orderc[6];
                                                          ctmp[7] = orderc[7];
                                                          iVar8 = secp256k1_ec_seckey_tweak_mul
                                                                            (CTX,ctmp,ctmp2);
                                                          if (iVar8 == 0) {
                                                            iVar8 = secp256k1_memcmp_var
                                                                              (zeros,ctmp,0x20);
                                                            if (iVar8 == 0) {
                                                              ctmp[0x18] = orderc[0x18];
                                                              ctmp[0x19] = orderc[0x19];
                                                              ctmp[0x1a] = orderc[0x1a];
                                                              ctmp[0x1b] = orderc[0x1b];
                                                              ctmp[0x1c] = orderc[0x1c];
                                                              ctmp[0x1d] = orderc[0x1d];
                                                              ctmp[0x1e] = orderc[0x1e];
                                                              ctmp[0x1f] = orderc[0x1f];
                                                              ctmp[0x10] = orderc[0x10];
                                                              ctmp[0x11] = orderc[0x11];
                                                              ctmp[0x12] = orderc[0x12];
                                                              ctmp[0x13] = orderc[0x13];
                                                              ctmp[0x14] = orderc[0x14];
                                                              ctmp[0x15] = orderc[0x15];
                                                              ctmp[0x16] = orderc[0x16];
                                                              ctmp[0x17] = orderc[0x17];
                                                              ctmp[8] = orderc[8];
                                                              ctmp[9] = orderc[9];
                                                              ctmp[10] = orderc[10];
                                                              ctmp[0xb] = orderc[0xb];
                                                              ctmp[0xc] = orderc[0xc];
                                                              ctmp[0xd] = orderc[0xd];
                                                              ctmp[0xe] = orderc[0xe];
                                                              ctmp[0xf] = orderc[0xf];
                                                              ctmp[0] = orderc[0];
                                                              ctmp[1] = orderc[1];
                                                              ctmp[2] = orderc[2];
                                                              ctmp[3] = orderc[3];
                                                              ctmp[4] = orderc[4];
                                                              ctmp[5] = orderc[5];
                                                              ctmp[6] = orderc[6];
                                                              ctmp[7] = orderc[7];
                                                              ctmp[0x1f] = '@';
                                                              iVar8 = secp256k1_ec_seckey_tweak_add
                                                                                (CTX,ctmp,orderc);
                                                              if (iVar8 == 0) {
                                                                iVar8 = secp256k1_memcmp_var
                                                                                  (zeros,ctmp,0x20);
                                                                if (iVar8 == 0) {
                                                                  ctmp[0x18] = orderc[0x18];
                                                                  ctmp[0x19] = orderc[0x19];
                                                                  ctmp[0x1a] = orderc[0x1a];
                                                                  ctmp[0x1b] = orderc[0x1b];
                                                                  ctmp[0x1c] = orderc[0x1c];
                                                                  ctmp[0x1d] = orderc[0x1d];
                                                                  ctmp[0x1e] = orderc[0x1e];
                                                                  ctmp[0x1f] = orderc[0x1f];
                                                                  ctmp[0x10] = orderc[0x10];
                                                                  ctmp[0x11] = orderc[0x11];
                                                                  ctmp[0x12] = orderc[0x12];
                                                                  ctmp[0x13] = orderc[0x13];
                                                                  ctmp[0x14] = orderc[0x14];
                                                                  ctmp[0x15] = orderc[0x15];
                                                                  ctmp[0x16] = orderc[0x16];
                                                                  ctmp[0x17] = orderc[0x17];
                                                                  ctmp[8] = orderc[8];
                                                                  ctmp[9] = orderc[9];
                                                                  ctmp[10] = orderc[10];
                                                                  ctmp[0xb] = orderc[0xb];
                                                                  ctmp[0xc] = orderc[0xc];
                                                                  ctmp[0xd] = orderc[0xd];
                                                                  ctmp[0xe] = orderc[0xe];
                                                                  ctmp[0xf] = orderc[0xf];
                                                                  ctmp[0] = orderc[0];
                                                                  ctmp[1] = orderc[1];
                                                                  ctmp[2] = orderc[2];
                                                                  ctmp[3] = orderc[3];
                                                                  ctmp[4] = orderc[4];
                                                                  ctmp[5] = orderc[5];
                                                                  ctmp[6] = orderc[6];
                                                                  ctmp[7] = orderc[7];
                                                                  ctmp[0x1f] = '@';
                                                                  iVar8 = 
                                                  secp256k1_ec_seckey_tweak_mul(CTX,ctmp,orderc);
                                                  if (iVar8 == 0) {
                                                    iVar8 = secp256k1_memcmp_var(zeros,ctmp,0x20);
                                                    if (iVar8 == 0) {
                                                      ctmp[0x18] = orderc[0x18];
                                                      ctmp[0x19] = orderc[0x19];
                                                      ctmp[0x1a] = orderc[0x1a];
                                                      ctmp[0x1b] = orderc[0x1b];
                                                      ctmp[0x1c] = orderc[0x1c];
                                                      ctmp[0x1d] = orderc[0x1d];
                                                      ctmp[0x1e] = orderc[0x1e];
                                                      ctmp[0x1f] = orderc[0x1f];
                                                      ctmp[0x10] = orderc[0x10];
                                                      ctmp[0x11] = orderc[0x11];
                                                      ctmp[0x12] = orderc[0x12];
                                                      ctmp[0x13] = orderc[0x13];
                                                      ctmp[0x14] = orderc[0x14];
                                                      ctmp[0x15] = orderc[0x15];
                                                      ctmp[0x16] = orderc[0x16];
                                                      ctmp[0x17] = orderc[0x17];
                                                      ctmp[8] = orderc[8];
                                                      ctmp[9] = orderc[9];
                                                      ctmp[10] = orderc[10];
                                                      ctmp[0xb] = orderc[0xb];
                                                      ctmp[0xc] = orderc[0xc];
                                                      ctmp[0xd] = orderc[0xd];
                                                      ctmp[0xe] = orderc[0xe];
                                                      ctmp[0xf] = orderc[0xf];
                                                      ctmp[0] = orderc[0];
                                                      ctmp[1] = orderc[1];
                                                      ctmp[2] = orderc[2];
                                                      ctmp[3] = orderc[3];
                                                      ctmp[4] = orderc[4];
                                                      ctmp[5] = orderc[5];
                                                      ctmp[6] = orderc[6];
                                                      ctmp[7] = orderc[7];
                                                      ctmp[0x1f] = '@';
                                                      iVar8 = secp256k1_ec_pubkey_tweak_add
                                                                        (CTX,&pubkey,orderc);
                                                      if (iVar8 == 0) {
                                                        iVar8 = secp256k1_memcmp_var
                                                                          (&pubkey,zeros,0x40);
                                                        if (iVar8 == 0) {
                                                          pubkey.data[0x38] = pubkey2.data[0x38];
                                                          pubkey.data[0x39] = pubkey2.data[0x39];
                                                          pubkey.data[0x3a] = pubkey2.data[0x3a];
                                                          pubkey.data[0x3b] = pubkey2.data[0x3b];
                                                          pubkey.data[0x3c] = pubkey2.data[0x3c];
                                                          pubkey.data[0x3d] = pubkey2.data[0x3d];
                                                          pubkey.data[0x3e] = pubkey2.data[0x3e];
                                                          pubkey.data[0x3f] = pubkey2.data[0x3f];
                                                          pubkey.data[0x30] = pubkey2.data[0x30];
                                                          pubkey.data[0x31] = pubkey2.data[0x31];
                                                          pubkey.data[0x32] = pubkey2.data[0x32];
                                                          pubkey.data[0x33] = pubkey2.data[0x33];
                                                          pubkey.data[0x34] = pubkey2.data[0x34];
                                                          pubkey.data[0x35] = pubkey2.data[0x35];
                                                          pubkey.data[0x36] = pubkey2.data[0x36];
                                                          pubkey.data[0x37] = pubkey2.data[0x37];
                                                          pubkey.data[0x28] = pubkey2.data[0x28];
                                                          pubkey.data[0x29] = pubkey2.data[0x29];
                                                          pubkey.data[0x2a] = pubkey2.data[0x2a];
                                                          pubkey.data[0x2b] = pubkey2.data[0x2b];
                                                          pubkey.data[0x2c] = pubkey2.data[0x2c];
                                                          pubkey.data[0x2d] = pubkey2.data[0x2d];
                                                          pubkey.data[0x2e] = pubkey2.data[0x2e];
                                                          pubkey.data[0x2f] = pubkey2.data[0x2f];
                                                          pubkey.data[0x20] = pubkey2.data[0x20];
                                                          pubkey.data[0x21] = pubkey2.data[0x21];
                                                          pubkey.data[0x22] = pubkey2.data[0x22];
                                                          pubkey.data[0x23] = pubkey2.data[0x23];
                                                          pubkey.data[0x24] = pubkey2.data[0x24];
                                                          pubkey.data[0x25] = pubkey2.data[0x25];
                                                          pubkey.data[0x26] = pubkey2.data[0x26];
                                                          pubkey.data[0x27] = pubkey2.data[0x27];
                                                          pubkey.data[0x18] = pubkey2.data[0x18];
                                                          pubkey.data[0x19] = pubkey2.data[0x19];
                                                          pubkey.data[0x1a] = pubkey2.data[0x1a];
                                                          pubkey.data[0x1b] = pubkey2.data[0x1b];
                                                          pubkey.data[0x1c] = pubkey2.data[0x1c];
                                                          pubkey.data[0x1d] = pubkey2.data[0x1d];
                                                          pubkey.data[0x1e] = pubkey2.data[0x1e];
                                                          pubkey.data[0x1f] = pubkey2.data[0x1f];
                                                          pubkey.data[0x10] = pubkey2.data[0x10];
                                                          pubkey.data[0x11] = pubkey2.data[0x11];
                                                          pubkey.data[0x12] = pubkey2.data[0x12];
                                                          pubkey.data[0x13] = pubkey2.data[0x13];
                                                          pubkey.data[0x14] = pubkey2.data[0x14];
                                                          pubkey.data[0x15] = pubkey2.data[0x15];
                                                          pubkey.data[0x16] = pubkey2.data[0x16];
                                                          pubkey.data[0x17] = pubkey2.data[0x17];
                                                          pubkey.data[8] = pubkey2.data[8];
                                                          pubkey.data[9] = pubkey2.data[9];
                                                          pubkey.data[10] = pubkey2.data[10];
                                                          pubkey.data[0xb] = pubkey2.data[0xb];
                                                          pubkey.data[0xc] = pubkey2.data[0xc];
                                                          pubkey.data[0xd] = pubkey2.data[0xd];
                                                          pubkey.data[0xe] = pubkey2.data[0xe];
                                                          pubkey.data[0xf] = pubkey2.data[0xf];
                                                          pubkey.data[0] = pubkey2.data[0];
                                                          pubkey.data[1] = pubkey2.data[1];
                                                          pubkey.data[2] = pubkey2.data[2];
                                                          pubkey.data[3] = pubkey2.data[3];
                                                          pubkey.data[4] = pubkey2.data[4];
                                                          pubkey.data[5] = pubkey2.data[5];
                                                          pubkey.data[6] = pubkey2.data[6];
                                                          pubkey.data[7] = pubkey2.data[7];
                                                          iVar8 = secp256k1_ec_pubkey_tweak_mul
                                                                            (CTX,&pubkey,orderc);
                                                          if (iVar8 == 0) {
                                                            iVar8 = secp256k1_memcmp_var
                                                                              (&pubkey,zeros,0x40);
                                                            if (iVar8 == 0) {
                                                              pubkey.data[0x38] = pubkey2.data[0x38]
                                                              ;
                                                              pubkey.data[0x39] = pubkey2.data[0x39]
                                                              ;
                                                              pubkey.data[0x3a] = pubkey2.data[0x3a]
                                                              ;
                                                              pubkey.data[0x3b] = pubkey2.data[0x3b]
                                                              ;
                                                              pubkey.data[0x3c] = pubkey2.data[0x3c]
                                                              ;
                                                              pubkey.data[0x3d] = pubkey2.data[0x3d]
                                                              ;
                                                              pubkey.data[0x3e] = pubkey2.data[0x3e]
                                                              ;
                                                              pubkey.data[0x3f] = pubkey2.data[0x3f]
                                                              ;
                                                              pubkey.data[0x30] = pubkey2.data[0x30]
                                                              ;
                                                              pubkey.data[0x31] = pubkey2.data[0x31]
                                                              ;
                                                              pubkey.data[0x32] = pubkey2.data[0x32]
                                                              ;
                                                              pubkey.data[0x33] = pubkey2.data[0x33]
                                                              ;
                                                              pubkey.data[0x34] = pubkey2.data[0x34]
                                                              ;
                                                              pubkey.data[0x35] = pubkey2.data[0x35]
                                                              ;
                                                              pubkey.data[0x36] = pubkey2.data[0x36]
                                                              ;
                                                              pubkey.data[0x37] = pubkey2.data[0x37]
                                                              ;
                                                              pubkey.data[0x28] = pubkey2.data[0x28]
                                                              ;
                                                              pubkey.data[0x29] = pubkey2.data[0x29]
                                                              ;
                                                              pubkey.data[0x2a] = pubkey2.data[0x2a]
                                                              ;
                                                              pubkey.data[0x2b] = pubkey2.data[0x2b]
                                                              ;
                                                              pubkey.data[0x2c] = pubkey2.data[0x2c]
                                                              ;
                                                              pubkey.data[0x2d] = pubkey2.data[0x2d]
                                                              ;
                                                              pubkey.data[0x2e] = pubkey2.data[0x2e]
                                                              ;
                                                              pubkey.data[0x2f] = pubkey2.data[0x2f]
                                                              ;
                                                              pubkey.data[0x20] = pubkey2.data[0x20]
                                                              ;
                                                              pubkey.data[0x21] = pubkey2.data[0x21]
                                                              ;
                                                              pubkey.data[0x22] = pubkey2.data[0x22]
                                                              ;
                                                              pubkey.data[0x23] = pubkey2.data[0x23]
                                                              ;
                                                              pubkey.data[0x24] = pubkey2.data[0x24]
                                                              ;
                                                              pubkey.data[0x25] = pubkey2.data[0x25]
                                                              ;
                                                              pubkey.data[0x26] = pubkey2.data[0x26]
                                                              ;
                                                              pubkey.data[0x27] = pubkey2.data[0x27]
                                                              ;
                                                              pubkey.data[0x18] = pubkey2.data[0x18]
                                                              ;
                                                              pubkey.data[0x19] = pubkey2.data[0x19]
                                                              ;
                                                              pubkey.data[0x1a] = pubkey2.data[0x1a]
                                                              ;
                                                              pubkey.data[0x1b] = pubkey2.data[0x1b]
                                                              ;
                                                              pubkey.data[0x1c] = pubkey2.data[0x1c]
                                                              ;
                                                              pubkey.data[0x1d] = pubkey2.data[0x1d]
                                                              ;
                                                              pubkey.data[0x1e] = pubkey2.data[0x1e]
                                                              ;
                                                              pubkey.data[0x1f] = pubkey2.data[0x1f]
                                                              ;
                                                              pubkey.data[0x10] = pubkey2.data[0x10]
                                                              ;
                                                              pubkey.data[0x11] = pubkey2.data[0x11]
                                                              ;
                                                              pubkey.data[0x12] = pubkey2.data[0x12]
                                                              ;
                                                              pubkey.data[0x13] = pubkey2.data[0x13]
                                                              ;
                                                              pubkey.data[0x14] = pubkey2.data[0x14]
                                                              ;
                                                              pubkey.data[0x15] = pubkey2.data[0x15]
                                                              ;
                                                              pubkey.data[0x16] = pubkey2.data[0x16]
                                                              ;
                                                              pubkey.data[0x17] = pubkey2.data[0x17]
                                                              ;
                                                              pubkey.data[8] = pubkey2.data[8];
                                                              pubkey.data[9] = pubkey2.data[9];
                                                              pubkey.data[10] = pubkey2.data[10];
                                                              pubkey.data[0xb] = pubkey2.data[0xb];
                                                              pubkey.data[0xc] = pubkey2.data[0xc];
                                                              pubkey.data[0xd] = pubkey2.data[0xd];
                                                              pubkey.data[0xe] = pubkey2.data[0xe];
                                                              pubkey.data[0xf] = pubkey2.data[0xf];
                                                              pubkey.data[0] = pubkey2.data[0];
                                                              pubkey.data[1] = pubkey2.data[1];
                                                              pubkey.data[2] = pubkey2.data[2];
                                                              pubkey.data[3] = pubkey2.data[3];
                                                              pubkey.data[4] = pubkey2.data[4];
                                                              pubkey.data[5] = pubkey2.data[5];
                                                              pubkey.data[6] = pubkey2.data[6];
                                                              pubkey.data[7] = pubkey2.data[7];
                                                              ctmp[0x18] = orderc[0x18];
                                                              ctmp[0x19] = orderc[0x19];
                                                              ctmp[0x1a] = orderc[0x1a];
                                                              ctmp[0x1b] = orderc[0x1b];
                                                              ctmp[0x1c] = orderc[0x1c];
                                                              ctmp[0x1d] = orderc[0x1d];
                                                              ctmp[0x1e] = orderc[0x1e];
                                                              ctmp[0x1f] = orderc[0x1f];
                                                              ctmp[0x10] = orderc[0x10];
                                                              ctmp[0x11] = orderc[0x11];
                                                              ctmp[0x12] = orderc[0x12];
                                                              ctmp[0x13] = orderc[0x13];
                                                              ctmp[0x14] = orderc[0x14];
                                                              ctmp[0x15] = orderc[0x15];
                                                              ctmp[0x16] = orderc[0x16];
                                                              ctmp[0x17] = orderc[0x17];
                                                              ctmp[8] = orderc[8];
                                                              ctmp[9] = orderc[9];
                                                              ctmp[10] = orderc[10];
                                                              ctmp[0xb] = orderc[0xb];
                                                              ctmp[0xc] = orderc[0xc];
                                                              ctmp[0xd] = orderc[0xd];
                                                              ctmp[0xe] = orderc[0xe];
                                                              ctmp[0xf] = orderc[0xf];
                                                              ctmp[0] = orderc[0];
                                                              ctmp[1] = orderc[1];
                                                              ctmp[2] = orderc[2];
                                                              ctmp[3] = orderc[3];
                                                              ctmp[4] = orderc[4];
                                                              ctmp[5] = orderc[5];
                                                              ctmp[6] = orderc[6];
                                                              ctmp[7] = orderc[7];
                                                              ctmp[0x1f] = '@';
                                                              ctmp2[0] = '\0';
                                                              ctmp2[1] = '\0';
                                                              ctmp2[2] = '\0';
                                                              ctmp2[3] = '\0';
                                                              ctmp2[4] = '\0';
                                                              ctmp2[5] = '\0';
                                                              ctmp2[6] = '\0';
                                                              ctmp2[7] = '\0';
                                                              ctmp2[8] = '\0';
                                                              ctmp2[9] = '\0';
                                                              ctmp2[10] = '\0';
                                                              ctmp2[0xb] = '\0';
                                                              ctmp2[0xc] = '\0';
                                                              ctmp2[0xd] = '\0';
                                                              ctmp2[0xe] = '\0';
                                                              ctmp2[0xf] = '\0';
                                                              ctmp2._16_15_ =
                                                                   SUB1615((undefined1  [16])0x0,0);
                                                              ctmp2[0x1f] = '\x01';
                                                              iVar8 = secp256k1_ec_seckey_tweak_add
                                                                                (CTX,ctmp2,ctmp);
                                                              if (iVar8 == 0) {
                                                                iVar8 = secp256k1_memcmp_var
                                                                                  (zeros,ctmp2,0x20)
                                                                ;
                                                                if (iVar8 == 0) {
                                                                  ctmp2[0x1f] = '\x01';
                                                                  iVar8 = 
                                                  secp256k1_ec_pubkey_tweak_add(CTX,&pubkey,ctmp2);
                                                  if (iVar8 == 0) {
                                                    iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40)
                                                    ;
                                                    if (iVar8 == 0) {
                                                      pubkey.data[0x38] = pubkey2.data[0x38];
                                                      pubkey.data[0x39] = pubkey2.data[0x39];
                                                      pubkey.data[0x3a] = pubkey2.data[0x3a];
                                                      pubkey.data[0x3b] = pubkey2.data[0x3b];
                                                      pubkey.data[0x3c] = pubkey2.data[0x3c];
                                                      pubkey.data[0x3d] = pubkey2.data[0x3d];
                                                      pubkey.data[0x3e] = pubkey2.data[0x3e];
                                                      pubkey.data[0x3f] = pubkey2.data[0x3f];
                                                      pubkey.data[0x30] = pubkey2.data[0x30];
                                                      pubkey.data[0x31] = pubkey2.data[0x31];
                                                      pubkey.data[0x32] = pubkey2.data[0x32];
                                                      pubkey.data[0x33] = pubkey2.data[0x33];
                                                      pubkey.data[0x34] = pubkey2.data[0x34];
                                                      pubkey.data[0x35] = pubkey2.data[0x35];
                                                      pubkey.data[0x36] = pubkey2.data[0x36];
                                                      pubkey.data[0x37] = pubkey2.data[0x37];
                                                      pubkey.data[0x28] = pubkey2.data[0x28];
                                                      pubkey.data[0x29] = pubkey2.data[0x29];
                                                      pubkey.data[0x2a] = pubkey2.data[0x2a];
                                                      pubkey.data[0x2b] = pubkey2.data[0x2b];
                                                      pubkey.data[0x2c] = pubkey2.data[0x2c];
                                                      pubkey.data[0x2d] = pubkey2.data[0x2d];
                                                      pubkey.data[0x2e] = pubkey2.data[0x2e];
                                                      pubkey.data[0x2f] = pubkey2.data[0x2f];
                                                      pubkey.data[0x20] = pubkey2.data[0x20];
                                                      pubkey.data[0x21] = pubkey2.data[0x21];
                                                      pubkey.data[0x22] = pubkey2.data[0x22];
                                                      pubkey.data[0x23] = pubkey2.data[0x23];
                                                      pubkey.data[0x24] = pubkey2.data[0x24];
                                                      pubkey.data[0x25] = pubkey2.data[0x25];
                                                      pubkey.data[0x26] = pubkey2.data[0x26];
                                                      pubkey.data[0x27] = pubkey2.data[0x27];
                                                      pubkey.data[0x18] = pubkey2.data[0x18];
                                                      pubkey.data[0x19] = pubkey2.data[0x19];
                                                      pubkey.data[0x1a] = pubkey2.data[0x1a];
                                                      pubkey.data[0x1b] = pubkey2.data[0x1b];
                                                      pubkey.data[0x1c] = pubkey2.data[0x1c];
                                                      pubkey.data[0x1d] = pubkey2.data[0x1d];
                                                      pubkey.data[0x1e] = pubkey2.data[0x1e];
                                                      pubkey.data[0x1f] = pubkey2.data[0x1f];
                                                      pubkey.data[0x10] = pubkey2.data[0x10];
                                                      pubkey.data[0x11] = pubkey2.data[0x11];
                                                      pubkey.data[0x12] = pubkey2.data[0x12];
                                                      pubkey.data[0x13] = pubkey2.data[0x13];
                                                      pubkey.data[0x14] = pubkey2.data[0x14];
                                                      pubkey.data[0x15] = pubkey2.data[0x15];
                                                      pubkey.data[0x16] = pubkey2.data[0x16];
                                                      pubkey.data[0x17] = pubkey2.data[0x17];
                                                      pubkey.data[8] = pubkey2.data[8];
                                                      pubkey.data[9] = pubkey2.data[9];
                                                      pubkey.data[10] = pubkey2.data[10];
                                                      pubkey.data[0xb] = pubkey2.data[0xb];
                                                      pubkey.data[0xc] = pubkey2.data[0xc];
                                                      pubkey.data[0xd] = pubkey2.data[0xd];
                                                      pubkey.data[0xe] = pubkey2.data[0xe];
                                                      pubkey.data[0xf] = pubkey2.data[0xf];
                                                      pubkey.data[0] = pubkey2.data[0];
                                                      pubkey.data[1] = pubkey2.data[1];
                                                      pubkey.data[2] = pubkey2.data[2];
                                                      pubkey.data[3] = pubkey2.data[3];
                                                      pubkey.data[4] = pubkey2.data[4];
                                                      pubkey.data[5] = pubkey2.data[5];
                                                      pubkey.data[6] = pubkey2.data[6];
                                                      pubkey.data[7] = pubkey2.data[7];
                                                      ctmp2[0x1f] = '\x02';
                                                      iVar8 = secp256k1_ec_seckey_tweak_add
                                                                        (CTX,ctmp2,ctmp);
                                                      if (iVar8 == 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 1"
                                                  ;
                                                  uVar9 = 0x17fd;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_memcmp_var(ctmp2,zeros,0x1f);
                                                    if ((iVar8 == 0) && (ctmp2[0x1f] == '\x01')) {
                                                      ctmp2[0x1f] = '\x02';
                                                      iVar8 = secp256k1_ec_pubkey_tweak_add
                                                                        (CTX,&pubkey,ctmp2);
                                                      if (iVar8 == 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1"
                                                  ;
                                                  uVar9 = 0x1800;
                                                  }
                                                  else {
                                                    ctmp2[0x1f] = '\x01';
                                                    iVar8 = secp256k1_ec_pubkey_create
                                                                      (CTX,&pubkey2,ctmp2);
                                                    if (iVar8 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey2, ctmp2) == 1"
                                                  ;
                                                  uVar9 = 0x1802;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_memcmp_var
                                                                      (&pubkey,&pubkey2,0x40);
                                                    if (iVar8 == 0) {
                                                      iVar8 = secp256k1_ec_pubkey_tweak_add
                                                                        (CTX,&pubkey,ctmp2);
                                                      if (iVar8 == 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1"
                                                  ;
                                                  uVar9 = 0x1805;
                                                  }
                                                  else {
                                                    ctmp2[0x1f] = '\x02';
                                                    iVar8 = secp256k1_ec_pubkey_tweak_mul
                                                                      (CTX,&pubkey2,ctmp2);
                                                    if (iVar8 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2) == 1"
                                                  ;
                                                  uVar9 = 0x1807;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_memcmp_var
                                                                      (&pubkey,&pubkey2,0x40);
                                                    if (iVar8 == 0) {
                                                      pubkey.data[0x10] = '\0';
                                                      pubkey.data[0x11] = '\0';
                                                      pubkey.data[0x12] = '\0';
                                                      pubkey.data[0x13] = '\0';
                                                      pubkey.data[0x14] = '\0';
                                                      pubkey.data[0x15] = '\0';
                                                      pubkey.data[0x16] = '\0';
                                                      pubkey.data[0x17] = '\0';
                                                      pubkey.data[0x18] = '\0';
                                                      pubkey.data[0x19] = '\0';
                                                      pubkey.data[0x1a] = '\0';
                                                      pubkey.data[0x1b] = '\0';
                                                      pubkey.data[0x1c] = '\0';
                                                      pubkey.data[0x1d] = '\0';
                                                      pubkey.data[0x1e] = '\0';
                                                      pubkey.data[0x1f] = '\0';
                                                      pubkeys[0] = (secp256k1_pubkey *)
                                                                   ((ulong)pubkeys[0] &
                                                                   0xffffffff00000000);
                                                      pubkey.data[0] = '\0';
                                                      pubkey.data[1] = '\0';
                                                      pubkey.data[2] = '\0';
                                                      pubkey.data[3] = '\0';
                                                      pubkey.data[4] = '\0';
                                                      pubkey.data[5] = '\0';
                                                      pubkey.data[6] = '\0';
                                                      pubkey.data[7] = '\0';
                                                      pubkey.data[8] = '\0';
                                                      pubkey.data[9] = '\0';
                                                      pubkey.data[10] = '\0';
                                                      pubkey.data[0xb] = '\0';
                                                      pubkey.data[0xc] = '\0';
                                                      pubkey.data[0xd] = '\0';
                                                      pubkey.data[0xe] = '\0';
                                                      pubkey.data[0xf] = '\0';
                                                      p_Var1 = (CTX->illegal_callback).fn;
                                                      pvVar2 = (CTX->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,counting_callback_fn,pubkeys);
                                                      iVar8 = secp256k1_ec_pubkey_tweak_add
                                                                        (CTX,&pubkey,ctmp2);
                                                      psVar3 = CTX;
                                                      if (iVar8 == 0) {
                                                        (CTX->illegal_callback).fn = p_Var1;
                                                        (psVar3->illegal_callback).data = pvVar2;
                                                        if ((int)pubkeys[0] == 1) {
                                                          iVar8 = secp256k1_memcmp_var
                                                                            (&pubkey,zeros,0x40);
                                                          if (iVar8 != 0) {
                                                            pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x180c;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pubkey.data[0x38] = pubkey2.data[0x38];
                                                  pubkey.data[0x39] = pubkey2.data[0x39];
                                                  pubkey.data[0x3a] = pubkey2.data[0x3a];
                                                  pubkey.data[0x3b] = pubkey2.data[0x3b];
                                                  pubkey.data[0x3c] = pubkey2.data[0x3c];
                                                  pubkey.data[0x3d] = pubkey2.data[0x3d];
                                                  pubkey.data[0x3e] = pubkey2.data[0x3e];
                                                  pubkey.data[0x3f] = pubkey2.data[0x3f];
                                                  pubkey.data[0x30] = pubkey2.data[0x30];
                                                  pubkey.data[0x31] = pubkey2.data[0x31];
                                                  pubkey.data[0x32] = pubkey2.data[0x32];
                                                  pubkey.data[0x33] = pubkey2.data[0x33];
                                                  pubkey.data[0x34] = pubkey2.data[0x34];
                                                  pubkey.data[0x35] = pubkey2.data[0x35];
                                                  pubkey.data[0x36] = pubkey2.data[0x36];
                                                  pubkey.data[0x37] = pubkey2.data[0x37];
                                                  pubkey.data[0x28] = pubkey2.data[0x28];
                                                  pubkey.data[0x29] = pubkey2.data[0x29];
                                                  pubkey.data[0x2a] = pubkey2.data[0x2a];
                                                  pubkey.data[0x2b] = pubkey2.data[0x2b];
                                                  pubkey.data[0x2c] = pubkey2.data[0x2c];
                                                  pubkey.data[0x2d] = pubkey2.data[0x2d];
                                                  pubkey.data[0x2e] = pubkey2.data[0x2e];
                                                  pubkey.data[0x2f] = pubkey2.data[0x2f];
                                                  pubkey.data[0x20] = pubkey2.data[0x20];
                                                  pubkey.data[0x21] = pubkey2.data[0x21];
                                                  pubkey.data[0x22] = pubkey2.data[0x22];
                                                  pubkey.data[0x23] = pubkey2.data[0x23];
                                                  pubkey.data[0x24] = pubkey2.data[0x24];
                                                  pubkey.data[0x25] = pubkey2.data[0x25];
                                                  pubkey.data[0x26] = pubkey2.data[0x26];
                                                  pubkey.data[0x27] = pubkey2.data[0x27];
                                                  pubkey.data[0x18] = pubkey2.data[0x18];
                                                  pubkey.data[0x19] = pubkey2.data[0x19];
                                                  pubkey.data[0x1a] = pubkey2.data[0x1a];
                                                  pubkey.data[0x1b] = pubkey2.data[0x1b];
                                                  pubkey.data[0x1c] = pubkey2.data[0x1c];
                                                  pubkey.data[0x1d] = pubkey2.data[0x1d];
                                                  pubkey.data[0x1e] = pubkey2.data[0x1e];
                                                  pubkey.data[0x1f] = pubkey2.data[0x1f];
                                                  pubkey.data[0x10] = pubkey2.data[0x10];
                                                  pubkey.data[0x11] = pubkey2.data[0x11];
                                                  pubkey.data[0x12] = pubkey2.data[0x12];
                                                  pubkey.data[0x13] = pubkey2.data[0x13];
                                                  pubkey.data[0x14] = pubkey2.data[0x14];
                                                  pubkey.data[0x15] = pubkey2.data[0x15];
                                                  pubkey.data[0x16] = pubkey2.data[0x16];
                                                  pubkey.data[0x17] = pubkey2.data[0x17];
                                                  pubkey.data[8] = pubkey2.data[8];
                                                  pubkey.data[9] = pubkey2.data[9];
                                                  pubkey.data[10] = pubkey2.data[10];
                                                  pubkey.data[0xb] = pubkey2.data[0xb];
                                                  pubkey.data[0xc] = pubkey2.data[0xc];
                                                  pubkey.data[0xd] = pubkey2.data[0xd];
                                                  pubkey.data[0xe] = pubkey2.data[0xe];
                                                  pubkey.data[0xf] = pubkey2.data[0xf];
                                                  pubkey.data[0] = pubkey2.data[0];
                                                  pubkey.data[1] = pubkey2.data[1];
                                                  pubkey.data[2] = pubkey2.data[2];
                                                  pubkey.data[3] = pubkey2.data[3];
                                                  pubkey.data[4] = pubkey2.data[4];
                                                  pubkey.data[5] = pubkey2.data[5];
                                                  pubkey.data[6] = pubkey2.data[6];
                                                  pubkey.data[7] = pubkey2.data[7];
                                                  pubkeys[0] = (secp256k1_pubkey *)
                                                               ((ulong)pubkeys[0] &
                                                               0xffffffff00000000);
                                                  pubkey2.data[0] = '\0';
                                                  pubkey2.data[1] = '\0';
                                                  pubkey2.data[2] = '\0';
                                                  pubkey2.data[3] = '\0';
                                                  pubkey2.data[4] = '\0';
                                                  pubkey2.data[5] = '\0';
                                                  pubkey2.data[6] = '\0';
                                                  pubkey2.data[7] = '\0';
                                                  pubkey2.data[8] = '\0';
                                                  pubkey2.data[9] = '\0';
                                                  pubkey2.data[10] = '\0';
                                                  pubkey2.data[0xb] = '\0';
                                                  pubkey2.data[0xc] = '\0';
                                                  pubkey2.data[0xd] = '\0';
                                                  pubkey2.data[0xe] = '\0';
                                                  pubkey2.data[0xf] = '\0';
                                                  pubkey2.data[0x10] = '\0';
                                                  pubkey2.data[0x11] = '\0';
                                                  pubkey2.data[0x12] = '\0';
                                                  pubkey2.data[0x13] = '\0';
                                                  pubkey2.data[0x14] = '\0';
                                                  pubkey2.data[0x15] = '\0';
                                                  pubkey2.data[0x16] = '\0';
                                                  pubkey2.data[0x17] = '\0';
                                                  pubkey2.data[0x18] = '\0';
                                                  pubkey2.data[0x19] = '\0';
                                                  pubkey2.data[0x1a] = '\0';
                                                  pubkey2.data[0x1b] = '\0';
                                                  pubkey2.data[0x1c] = '\0';
                                                  pubkey2.data[0x1d] = '\0';
                                                  pubkey2.data[0x1e] = '\0';
                                                  pubkey2.data[0x1f] = '\0';
                                                  p_Var1 = (psVar3->illegal_callback).fn;
                                                  pvVar2 = (psVar3->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (psVar3,counting_callback_fn,pubkeys);
                                                  iVar8 = secp256k1_ec_pubkey_tweak_mul
                                                                    (CTX,&pubkey2,ctmp2);
                                                  psVar3 = CTX;
                                                  if (iVar8 == 0) {
                                                    (CTX->illegal_callback).fn = p_Var1;
                                                    (psVar3->illegal_callback).data = pvVar2;
                                                    if ((int)pubkeys[0] == 1) {
                                                      iVar8 = secp256k1_memcmp_var
                                                                        (&pubkey2,zeros,0x40);
                                                      if (iVar8 == 0) {
                                                        iVar8 = secp256k1_ec_seckey_verify
                                                                          (psVar3,ctmp);
                                                        if (iVar8 == 0) {
                                                          pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 1"
                                                  ;
                                                  uVar9 = 0x1812;
                                                  }
                                                  else {
                                                    pubkeys[0] = (secp256k1_pubkey *)
                                                                 ((ulong)pubkeys[0] &
                                                                 0xffffffff00000000);
                                                    p_Var1 = (CTX->illegal_callback).fn;
                                                    pvVar2 = (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,pubkeys);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("seckey != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar3 = CTX;
                                                    (CTX->illegal_callback).fn = p_Var1;
                                                    (psVar3->illegal_callback).data = pvVar2;
                                                    if ((int)pubkeys[0] == 1) {
                                                      pubkeys[0] = (secp256k1_pubkey *)
                                                                   ((ulong)pubkeys[0] &
                                                                   0xffffffff00000000);
                                                      ctmp2[0] = '\0';
                                                      ctmp2[1] = '\0';
                                                      ctmp2[2] = '\0';
                                                      ctmp2[3] = '\0';
                                                      ctmp2[4] = '\0';
                                                      ctmp2[5] = '\0';
                                                      ctmp2[6] = '\0';
                                                      ctmp2[7] = '\0';
                                                      ctmp2[8] = '\0';
                                                      ctmp2[9] = '\0';
                                                      ctmp2[10] = '\0';
                                                      ctmp2[0xb] = '\0';
                                                      ctmp2[0xc] = '\0';
                                                      ctmp2[0xd] = '\0';
                                                      ctmp2[0xe] = '\0';
                                                      ctmp2[0xf] = '\0';
                                                      ctmp2._16_15_ =
                                                           SUB1615((undefined1  [16])0x0,0);
                                                      ctmp2[0x1f] = '\x04';
                                                      p_Var1 = (psVar3->illegal_callback).fn;
                                                      pvVar2 = (psVar3->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar3,counting_callback_fn,pubkeys
                                                                );
                                                      (*(CTX->illegal_callback).fn)
                                                                ("pubkey != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar3 = CTX;
                                                      (CTX->illegal_callback).fn = p_Var1;
                                                      (psVar3->illegal_callback).data = pvVar2;
                                                      if ((int)pubkeys[0] == 1) {
                                                        pubkeys[0] = (secp256k1_pubkey *)
                                                                     ((ulong)pubkeys[0] &
                                                                     0xffffffff00000000);
                                                        p_Var1 = (psVar3->illegal_callback).fn;
                                                        pvVar2 = (psVar3->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar3,counting_callback_fn,
                                                                   pubkeys);
                                                        (*(CTX->illegal_callback).fn)
                                                                  ("tweak32 != NULL",
                                                                   (CTX->illegal_callback).data);
                                                        psVar3 = CTX;
                                                        (CTX->illegal_callback).fn = p_Var1;
                                                        (psVar3->illegal_callback).data = pvVar2;
                                                        if ((int)pubkeys[0] == 1) {
                                                          pubkeys[0] = (secp256k1_pubkey *)
                                                                       ((ulong)pubkeys[0] &
                                                                       0xffffffff00000000);
                                                          ctmp2[0] = '\0';
                                                          ctmp2[1] = '\0';
                                                          ctmp2[2] = '\0';
                                                          ctmp2[3] = '\0';
                                                          ctmp2[4] = '\0';
                                                          ctmp2[5] = '\0';
                                                          ctmp2[6] = '\0';
                                                          ctmp2[7] = '\0';
                                                          ctmp2[8] = '\0';
                                                          ctmp2[9] = '\0';
                                                          ctmp2[10] = '\0';
                                                          ctmp2[0xb] = '\0';
                                                          ctmp2[0xc] = '\0';
                                                          ctmp2[0xd] = '\0';
                                                          ctmp2[0xe] = '\0';
                                                          ctmp2[0xf] = '\0';
                                                          ctmp2._16_15_ =
                                                               SUB1615((undefined1  [16])0x0,0);
                                                          ctmp2[0x1f] = '\x04';
                                                          p_Var1 = (psVar3->illegal_callback).fn;
                                                          pvVar2 = (psVar3->illegal_callback).data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar3,counting_callback_fn,
                                                                     pubkeys);
                                                          iVar8 = secp256k1_ec_pubkey_tweak_mul
                                                                            (CTX,(secp256k1_pubkey *
                                                                                 )0x0,ctmp2);
                                                          psVar3 = CTX;
                                                          if (iVar8 == 0) {
                                                            (CTX->illegal_callback).fn = p_Var1;
                                                            (psVar3->illegal_callback).data = pvVar2
                                                            ;
                                                            if ((int)pubkeys[0] == 1) {
                                                              pubkeys[0] = (secp256k1_pubkey *)
                                                                           ((ulong)pubkeys[0] &
                                                                           0xffffffff00000000);
                                                              p_Var1 = (psVar3->illegal_callback).fn
                                                              ;
                                                              pvVar2 = (psVar3->illegal_callback).
                                                                       data;
                                                              secp256k1_context_set_illegal_callback
                                                                        (psVar3,counting_callback_fn
                                                                         ,pubkeys);
                                                              iVar8 = secp256k1_ec_pubkey_tweak_mul
                                                                                (CTX,&pubkey,
                                                                                 (uchar *)0x0);
                                                              psVar3 = CTX;
                                                              if (iVar8 == 0) {
                                                                (CTX->illegal_callback).fn = p_Var1;
                                                                (psVar3->illegal_callback).data =
                                                                     pvVar2;
                                                                if ((int)pubkeys[0] == 1) {
                                                                  pubkeys[0] = (secp256k1_pubkey *)
                                                                               ((ulong)pubkeys[0] &
                                                                               0xffffffff00000000);
                                                                  ctmp2[0] = '\0';
                                                                  ctmp2[1] = '\0';
                                                                  ctmp2[2] = '\0';
                                                                  ctmp2[3] = '\0';
                                                                  ctmp2[4] = '\0';
                                                                  ctmp2[5] = '\0';
                                                                  ctmp2[6] = '\0';
                                                                  ctmp2[7] = '\0';
                                                                  ctmp2[8] = '\0';
                                                                  ctmp2[9] = '\0';
                                                                  ctmp2[10] = '\0';
                                                                  ctmp2[0xb] = '\0';
                                                                  ctmp2[0xc] = '\0';
                                                                  ctmp2[0xd] = '\0';
                                                                  ctmp2[0xe] = '\0';
                                                                  ctmp2[0xf] = '\0';
                                                                  ctmp2[0x10] = '\0';
                                                                  ctmp2[0x11] = '\0';
                                                                  ctmp2[0x12] = '\0';
                                                                  ctmp2[0x13] = '\0';
                                                                  ctmp2[0x14] = '\0';
                                                                  ctmp2[0x15] = '\0';
                                                                  ctmp2[0x16] = '\0';
                                                                  ctmp2[0x17] = '\0';
                                                                  ctmp2[0x18] = '\0';
                                                                  ctmp2[0x19] = '\0';
                                                                  ctmp2[0x1a] = '\0';
                                                                  ctmp2[0x1b] = '\0';
                                                                  ctmp2[0x1c] = '\0';
                                                                  ctmp2[0x1d] = '\0';
                                                                  ctmp2[0x1e] = '\0';
                                                                  ctmp2[0x1f] = '\0';
                                                                  p_Var1 = (psVar3->illegal_callback
                                                                           ).fn;
                                                                  pvVar2 = (psVar3->illegal_callback
                                                                           ).data;
                                                                                                                                    
                                                  secp256k1_context_set_illegal_callback
                                                            (psVar3,counting_callback_fn,pubkeys);
                                                  (*(CTX->illegal_callback).fn)
                                                            ("seckey != NULL",
                                                             (CTX->illegal_callback).data);
                                                  psVar3 = CTX;
                                                  (CTX->illegal_callback).fn = p_Var1;
                                                  (psVar3->illegal_callback).data = pvVar2;
                                                  if ((int)pubkeys[0] == 1) {
                                                    pubkeys[0] = (secp256k1_pubkey *)
                                                                 ((ulong)pubkeys[0] &
                                                                 0xffffffff00000000);
                                                    p_Var1 = (psVar3->illegal_callback).fn;
                                                    pvVar2 = (psVar3->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (psVar3,counting_callback_fn,pubkeys);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("tweak32 != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar3 = CTX;
                                                    (CTX->illegal_callback).fn = p_Var1;
                                                    (psVar3->illegal_callback).data = pvVar2;
                                                    if ((int)pubkeys[0] == 1) {
                                                      pubkeys[0] = (secp256k1_pubkey *)
                                                                   ((ulong)pubkeys[0] &
                                                                   0xffffffff00000000);
                                                      ctmp2[0] = '\0';
                                                      ctmp2[1] = '\0';
                                                      ctmp2[2] = '\0';
                                                      ctmp2[3] = '\0';
                                                      ctmp2[4] = '\0';
                                                      ctmp2[5] = '\0';
                                                      ctmp2[6] = '\0';
                                                      ctmp2[7] = '\0';
                                                      ctmp2[8] = '\0';
                                                      ctmp2[9] = '\0';
                                                      ctmp2[10] = '\0';
                                                      ctmp2[0xb] = '\0';
                                                      ctmp2[0xc] = '\0';
                                                      ctmp2[0xd] = '\0';
                                                      ctmp2[0xe] = '\0';
                                                      ctmp2[0xf] = '\0';
                                                      ctmp2._16_15_ =
                                                           SUB1615((undefined1  [16])0x0,0);
                                                      ctmp2[0x1f] = '\x01';
                                                      p_Var1 = (psVar3->illegal_callback).fn;
                                                      pvVar2 = (psVar3->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar3,counting_callback_fn,pubkeys
                                                                );
                                                      (*(CTX->illegal_callback).fn)
                                                                ("seckey != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar3 = CTX;
                                                      (CTX->illegal_callback).fn = p_Var1;
                                                      (psVar3->illegal_callback).data = pvVar2;
                                                      if ((int)pubkeys[0] == 1) {
                                                        pubkeys[0] = (secp256k1_pubkey *)
                                                                     ((ulong)pubkeys[0] &
                                                                     0xffffffff00000000);
                                                        p_Var1 = (psVar3->illegal_callback).fn;
                                                        pvVar2 = (psVar3->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar3,counting_callback_fn,
                                                                   pubkeys);
                                                        (*(CTX->illegal_callback).fn)
                                                                  ("tweak32 != NULL",
                                                                   (CTX->illegal_callback).data);
                                                        psVar3 = CTX;
                                                        (CTX->illegal_callback).fn = p_Var1;
                                                        (psVar3->illegal_callback).data = pvVar2;
                                                        if ((int)pubkeys[0] == 1) {
                                                          pubkeys[0] = (secp256k1_pubkey *)
                                                                       ((ulong)pubkeys[0] &
                                                                       0xffffffff00000000);
                                                          p_Var1 = (psVar3->illegal_callback).fn;
                                                          pvVar2 = (psVar3->illegal_callback).data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar3,counting_callback_fn,
                                                                     pubkeys);
                                                          (*(CTX->illegal_callback).fn)
                                                                    ("pubkey != NULL",
                                                                     (CTX->illegal_callback).data);
                                                          psVar3 = CTX;
                                                          (CTX->illegal_callback).fn = p_Var1;
                                                          (psVar3->illegal_callback).data = pvVar2;
                                                          if ((int)pubkeys[0] == 1) {
                                                            builtin_memcpy(pubkey.data,
                                                                                                                                                      
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(pubkey.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  pubkeys[0] = (secp256k1_pubkey *)
                                                               ((ulong)pubkeys[0] &
                                                               0xffffffff00000000);
                                                  builtin_memcpy(pubkey.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(pubkey.data + 0x30,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  p_Var1 = (psVar3->illegal_callback).fn;
                                                  pvVar2 = (psVar3->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (psVar3,counting_callback_fn,pubkeys);
                                                  iVar8 = secp256k1_ec_pubkey_create
                                                                    (CTX,&pubkey,(uchar *)0x0);
                                                  psVar3 = CTX;
                                                  if (iVar8 == 0) {
                                                    (CTX->illegal_callback).fn = p_Var1;
                                                    (psVar3->illegal_callback).data = pvVar2;
                                                    if ((int)pubkeys[0] == 1) {
                                                      iVar8 = secp256k1_memcmp_var
                                                                        (&pubkey,zeros,0x40);
                                                      if (iVar8 != 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1826;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pubkey.data[8] = 0xff;
                                                  pubkey.data[9] = 0xff;
                                                  pubkey.data[10] = 0xff;
                                                  pubkey.data[0xb] = 0xff;
                                                  pubkey.data[0] = 0xff;
                                                  pubkey.data[1] = 0xff;
                                                  pubkey.data[2] = 0xff;
                                                  pubkey.data[3] = 0xff;
                                                  pubkey.data[4] = 0xff;
                                                  pubkey.data[5] = 0xff;
                                                  pubkey.data[6] = 0xff;
                                                  pubkey.data[7] = 0xff;
                                                  pubkey.data[0xc] = 0xff;
                                                  pubkey.data[0xd] = 0xff;
                                                  pubkey.data[0xe] = 0xff;
                                                  pubkey.data[0xf] = 0xff;
                                                  pubkey.data[0x18] = 0xff;
                                                  pubkey.data[0x19] = 0xff;
                                                  pubkey.data[0x1a] = 0xff;
                                                  pubkey.data[0x1b] = 0xff;
                                                  pubkey.data[0x10] = 0xff;
                                                  pubkey.data[0x11] = 0xff;
                                                  pubkey.data[0x12] = 0xff;
                                                  pubkey.data[0x13] = 0xff;
                                                  pubkey.data[0x14] = 0xff;
                                                  pubkey.data[0x15] = 0xff;
                                                  pubkey.data[0x16] = 0xff;
                                                  pubkey.data[0x17] = 0xff;
                                                  pubkey.data[0x1c] = 0xff;
                                                  pubkey.data[0x1d] = 0xff;
                                                  pubkey.data[0x1e] = 0xff;
                                                  pubkey.data[0x1f] = 0xff;
                                                  pubkey.data[0x28] = 0xff;
                                                  pubkey.data[0x29] = 0xff;
                                                  pubkey.data[0x2a] = 0xff;
                                                  pubkey.data[0x2b] = 0xff;
                                                  pubkey.data[0x20] = 0xff;
                                                  pubkey.data[0x21] = 0xff;
                                                  pubkey.data[0x22] = 0xff;
                                                  pubkey.data[0x23] = 0xff;
                                                  pubkey.data[0x24] = 0xff;
                                                  pubkey.data[0x25] = 0xff;
                                                  pubkey.data[0x26] = 0xff;
                                                  pubkey.data[0x27] = 0xff;
                                                  pubkey.data[0x2c] = 0xff;
                                                  pubkey.data[0x2d] = 0xff;
                                                  pubkey.data[0x2e] = 0xff;
                                                  pubkey.data[0x2f] = 0xff;
                                                  pubkey.data[0x38] = 0xff;
                                                  pubkey.data[0x39] = 0xff;
                                                  pubkey.data[0x3a] = 0xff;
                                                  pubkey.data[0x3b] = 0xff;
                                                  pubkey.data[0x30] = 0xff;
                                                  pubkey.data[0x31] = 0xff;
                                                  pubkey.data[0x32] = 0xff;
                                                  pubkey.data[0x33] = 0xff;
                                                  pubkey.data[0x34] = 0xff;
                                                  pubkey.data[0x35] = 0xff;
                                                  pubkey.data[0x36] = 0xff;
                                                  pubkey.data[0x37] = 0xff;
                                                  pubkey.data[0x3c] = 0xff;
                                                  pubkey.data[0x3d] = 0xff;
                                                  pubkey.data[0x3e] = 0xff;
                                                  pubkey.data[0x3f] = 0xff;
                                                  len = 0;
                                                  p_Var1 = (CTX->illegal_callback).fn;
                                                  pvVar2 = (CTX->illegal_callback).data;
                                                  pubkeys[0] = &pubkey_one;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,&len);
                                                  iVar8 = secp256k1_ec_pubkey_combine
                                                                    (CTX,&pubkey,pubkeys,0);
                                                  psVar3 = CTX;
                                                  if (iVar8 == 0) {
                                                    (CTX->illegal_callback).fn = p_Var1;
                                                    (psVar3->illegal_callback).data = pvVar2;
                                                    if ((int)len == 1) {
                                                      len = 0;
                                                      iVar8 = secp256k1_memcmp_var
                                                                        (&pubkey,zeros,0x40);
                                                      if (iVar8 != 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1830;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  len = len & 0xffffffff00000000;
                                                  p_Var1 = (CTX->illegal_callback).fn;
                                                  pvVar2 = (CTX->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,&len);
                                                  iVar8 = secp256k1_ec_pubkey_combine
                                                                    (CTX,(secp256k1_pubkey *)0x0,
                                                                     pubkeys,1);
                                                  psVar3 = CTX;
                                                  if (iVar8 == 0) {
                                                    (CTX->illegal_callback).fn = p_Var1;
                                                    (psVar3->illegal_callback).data = pvVar2;
                                                    if ((int)len == 1) {
                                                      iVar8 = secp256k1_memcmp_var
                                                                        (&pubkey,zeros,0x40);
                                                      if (iVar8 == 0) {
                                                        pubkey.data[0x38] = 0xff;
                                                        pubkey.data[0x39] = 0xff;
                                                        pubkey.data[0x3a] = 0xff;
                                                        pubkey.data[0x3b] = 0xff;
                                                        pubkey.data[0x30] = 0xff;
                                                        pubkey.data[0x31] = 0xff;
                                                        pubkey.data[0x32] = 0xff;
                                                        pubkey.data[0x33] = 0xff;
                                                        pubkey.data[0x34] = 0xff;
                                                        pubkey.data[0x35] = 0xff;
                                                        pubkey.data[0x36] = 0xff;
                                                        pubkey.data[0x37] = 0xff;
                                                        pubkey.data[0x3c] = 0xff;
                                                        pubkey.data[0x3d] = 0xff;
                                                        pubkey.data[0x3e] = 0xff;
                                                        pubkey.data[0x3f] = 0xff;
                                                        pubkey.data[0x28] = 0xff;
                                                        pubkey.data[0x29] = 0xff;
                                                        pubkey.data[0x2a] = 0xff;
                                                        pubkey.data[0x2b] = 0xff;
                                                        pubkey.data[0x20] = 0xff;
                                                        pubkey.data[0x21] = 0xff;
                                                        pubkey.data[0x22] = 0xff;
                                                        pubkey.data[0x23] = 0xff;
                                                        pubkey.data[0x24] = 0xff;
                                                        pubkey.data[0x25] = 0xff;
                                                        pubkey.data[0x26] = 0xff;
                                                        pubkey.data[0x27] = 0xff;
                                                        pubkey.data[0x2c] = 0xff;
                                                        pubkey.data[0x2d] = 0xff;
                                                        pubkey.data[0x2e] = 0xff;
                                                        pubkey.data[0x2f] = 0xff;
                                                        pubkey.data[0x18] = 0xff;
                                                        pubkey.data[0x19] = 0xff;
                                                        pubkey.data[0x1a] = 0xff;
                                                        pubkey.data[0x1b] = 0xff;
                                                        pubkey.data[0x10] = 0xff;
                                                        pubkey.data[0x11] = 0xff;
                                                        pubkey.data[0x12] = 0xff;
                                                        pubkey.data[0x13] = 0xff;
                                                        pubkey.data[0x14] = 0xff;
                                                        pubkey.data[0x15] = 0xff;
                                                        pubkey.data[0x16] = 0xff;
                                                        pubkey.data[0x17] = 0xff;
                                                        pubkey.data[0x1c] = 0xff;
                                                        pubkey.data[0x1d] = 0xff;
                                                        pubkey.data[0x1e] = 0xff;
                                                        pubkey.data[0x1f] = 0xff;
                                                        pubkey.data[8] = 0xff;
                                                        pubkey.data[9] = 0xff;
                                                        pubkey.data[10] = 0xff;
                                                        pubkey.data[0xb] = 0xff;
                                                        pubkey.data[0] = 0xff;
                                                        pubkey.data[1] = 0xff;
                                                        pubkey.data[2] = 0xff;
                                                        pubkey.data[3] = 0xff;
                                                        pubkey.data[4] = 0xff;
                                                        pubkey.data[5] = 0xff;
                                                        pubkey.data[6] = 0xff;
                                                        pubkey.data[7] = 0xff;
                                                        pubkey.data[0xc] = 0xff;
                                                        pubkey.data[0xd] = 0xff;
                                                        pubkey.data[0xe] = 0xff;
                                                        pubkey.data[0xf] = 0xff;
                                                        len = 0;
                                                        p_Var1 = (CTX->illegal_callback).fn;
                                                        pvVar2 = (CTX->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (CTX,counting_callback_fn,&len);
                                                        iVar8 = secp256k1_ec_pubkey_combine
                                                                          (CTX,&pubkey,
                                                                           (secp256k1_pubkey **)0x0,
                                                                           1);
                                                        psVar3 = CTX;
                                                        if (iVar8 == 0) {
                                                          (CTX->illegal_callback).fn = p_Var1;
                                                          (psVar3->illegal_callback).data = pvVar2;
                                                          if ((int)len == 1) {
                                                            len = 0;
                                                            iVar8 = secp256k1_memcmp_var
                                                                              (&pubkey,zeros,0x40);
                                                            if (iVar8 == 0) {
                                                              pubkeys[0] = &pubkey_negone;
                                                              pubkey.data[8] = 0xff;
                                                              pubkey.data[9] = 0xff;
                                                              pubkey.data[10] = 0xff;
                                                              pubkey.data[0xb] = 0xff;
                                                              pubkey.data[0] = 0xff;
                                                              pubkey.data[1] = 0xff;
                                                              pubkey.data[2] = 0xff;
                                                              pubkey.data[3] = 0xff;
                                                              pubkey.data[4] = 0xff;
                                                              pubkey.data[5] = 0xff;
                                                              pubkey.data[6] = 0xff;
                                                              pubkey.data[7] = 0xff;
                                                              pubkey.data[0xc] = 0xff;
                                                              pubkey.data[0xd] = 0xff;
                                                              pubkey.data[0xe] = 0xff;
                                                              pubkey.data[0xf] = 0xff;
                                                              pubkey.data[0x18] = 0xff;
                                                              pubkey.data[0x19] = 0xff;
                                                              pubkey.data[0x1a] = 0xff;
                                                              pubkey.data[0x1b] = 0xff;
                                                              pubkey.data[0x10] = 0xff;
                                                              pubkey.data[0x11] = 0xff;
                                                              pubkey.data[0x12] = 0xff;
                                                              pubkey.data[0x13] = 0xff;
                                                              pubkey.data[0x14] = 0xff;
                                                              pubkey.data[0x15] = 0xff;
                                                              pubkey.data[0x16] = 0xff;
                                                              pubkey.data[0x17] = 0xff;
                                                              pubkey.data[0x1c] = 0xff;
                                                              pubkey.data[0x1d] = 0xff;
                                                              pubkey.data[0x1e] = 0xff;
                                                              pubkey.data[0x1f] = 0xff;
                                                              pubkey.data[0x28] = 0xff;
                                                              pubkey.data[0x29] = 0xff;
                                                              pubkey.data[0x2a] = 0xff;
                                                              pubkey.data[0x2b] = 0xff;
                                                              pubkey.data[0x20] = 0xff;
                                                              pubkey.data[0x21] = 0xff;
                                                              pubkey.data[0x22] = 0xff;
                                                              pubkey.data[0x23] = 0xff;
                                                              pubkey.data[0x24] = 0xff;
                                                              pubkey.data[0x25] = 0xff;
                                                              pubkey.data[0x26] = 0xff;
                                                              pubkey.data[0x27] = 0xff;
                                                              pubkey.data[0x2c] = 0xff;
                                                              pubkey.data[0x2d] = 0xff;
                                                              pubkey.data[0x2e] = 0xff;
                                                              pubkey.data[0x2f] = 0xff;
                                                              pubkey.data[0x38] = 0xff;
                                                              pubkey.data[0x39] = 0xff;
                                                              pubkey.data[0x3a] = 0xff;
                                                              pubkey.data[0x3b] = 0xff;
                                                              pubkey.data[0x30] = 0xff;
                                                              pubkey.data[0x31] = 0xff;
                                                              pubkey.data[0x32] = 0xff;
                                                              pubkey.data[0x33] = 0xff;
                                                              pubkey.data[0x34] = 0xff;
                                                              pubkey.data[0x35] = 0xff;
                                                              pubkey.data[0x36] = 0xff;
                                                              pubkey.data[0x37] = 0xff;
                                                              pubkey.data[0x3c] = 0xff;
                                                              pubkey.data[0x3d] = 0xff;
                                                              pubkey.data[0x3e] = 0xff;
                                                              pubkey.data[0x3f] = 0xff;
                                                              len = 0;
                                                              iVar8 = secp256k1_ec_pubkey_combine
                                                                                (CTX,&pubkey,pubkeys
                                                                                 ,1);
                                                              if (iVar8 == 0) {
                                                                pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 1) == 1"
                                                  ;
                                                  uVar9 = 0x183b;
                                                  }
                                                  else {
                                                    len = 0;
                                                    iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40)
                                                    ;
                                                    if (iVar8 < 1) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
                                                  ;
                                                  uVar9 = 0x183d;
                                                  }
                                                  else {
                                                    len = 0x21;
                                                    iVar8 = secp256k1_ec_pubkey_serialize
                                                                      (CTX,ctmp,&len,&pubkey,0x102);
                                                    if (iVar8 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1"
                                                  ;
                                                  uVar9 = 0x183f;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_ec_pubkey_serialize
                                                                      (CTX,ctmp2,&len,&pubkey_negone
                                                                       ,0x102);
                                                    if (iVar8 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_negone, SECP256K1_EC_COMPRESSED) == 1"
                                                  ;
                                                  uVar9 = 0x1840;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_memcmp_var(ctmp,ctmp2,0x21);
                                                    if (iVar8 == 0) {
                                                      pubkey.data[8] = 0xff;
                                                      pubkey.data[9] = 0xff;
                                                      pubkey.data[10] = 0xff;
                                                      pubkey.data[0xb] = 0xff;
                                                      pubkey.data[0] = 0xff;
                                                      pubkey.data[1] = 0xff;
                                                      pubkey.data[2] = 0xff;
                                                      pubkey.data[3] = 0xff;
                                                      pubkey.data[4] = 0xff;
                                                      pubkey.data[5] = 0xff;
                                                      pubkey.data[6] = 0xff;
                                                      pubkey.data[7] = 0xff;
                                                      pubkey.data[0xc] = 0xff;
                                                      pubkey.data[0xd] = 0xff;
                                                      pubkey.data[0xe] = 0xff;
                                                      pubkey.data[0xf] = 0xff;
                                                      pubkey.data[0x18] = 0xff;
                                                      pubkey.data[0x19] = 0xff;
                                                      pubkey.data[0x1a] = 0xff;
                                                      pubkey.data[0x1b] = 0xff;
                                                      pubkey.data[0x10] = 0xff;
                                                      pubkey.data[0x11] = 0xff;
                                                      pubkey.data[0x12] = 0xff;
                                                      pubkey.data[0x13] = 0xff;
                                                      pubkey.data[0x14] = 0xff;
                                                      pubkey.data[0x15] = 0xff;
                                                      pubkey.data[0x16] = 0xff;
                                                      pubkey.data[0x17] = 0xff;
                                                      pubkey.data[0x1c] = 0xff;
                                                      pubkey.data[0x1d] = 0xff;
                                                      pubkey.data[0x1e] = 0xff;
                                                      pubkey.data[0x1f] = 0xff;
                                                      pubkey.data[0x28] = 0xff;
                                                      pubkey.data[0x29] = 0xff;
                                                      pubkey.data[0x2a] = 0xff;
                                                      pubkey.data[0x2b] = 0xff;
                                                      pubkey.data[0x20] = 0xff;
                                                      pubkey.data[0x21] = 0xff;
                                                      pubkey.data[0x22] = 0xff;
                                                      pubkey.data[0x23] = 0xff;
                                                      pubkey.data[0x24] = 0xff;
                                                      pubkey.data[0x25] = 0xff;
                                                      pubkey.data[0x26] = 0xff;
                                                      pubkey.data[0x27] = 0xff;
                                                      pubkey.data[0x2c] = 0xff;
                                                      pubkey.data[0x2d] = 0xff;
                                                      pubkey.data[0x2e] = 0xff;
                                                      pubkey.data[0x2f] = 0xff;
                                                      pubkey.data[0x38] = 0xff;
                                                      pubkey.data[0x39] = 0xff;
                                                      pubkey.data[0x3a] = 0xff;
                                                      pubkey.data[0x3b] = 0xff;
                                                      pubkey.data[0x30] = 0xff;
                                                      pubkey.data[0x31] = 0xff;
                                                      pubkey.data[0x32] = 0xff;
                                                      pubkey.data[0x33] = 0xff;
                                                      pubkey.data[0x34] = 0xff;
                                                      pubkey.data[0x35] = 0xff;
                                                      pubkey.data[0x36] = 0xff;
                                                      pubkey.data[0x37] = 0xff;
                                                      pubkey.data[0x3c] = 0xff;
                                                      pubkey.data[0x3d] = 0xff;
                                                      pubkey.data[0x3e] = 0xff;
                                                      pubkey.data[0x3f] = 0xff;
                                                      _zzq_result_21 = 0;
                                                      pubkeys[0] = &pubkey_one;
                                                      pubkeys[1] = &pubkey_negone;
                                                      iVar8 = secp256k1_ec_pubkey_combine
                                                                        (CTX,&pubkey,pubkeys,2);
                                                      if (iVar8 == 0) {
                                                        _zzq_result_21 = 0;
                                                        iVar8 = secp256k1_memcmp_var
                                                                          (&pubkey,zeros,0x40);
                                                        if (iVar8 == 0) {
                                                          pubkey.data[8] = 0xff;
                                                          pubkey.data[9] = 0xff;
                                                          pubkey.data[10] = 0xff;
                                                          pubkey.data[0xb] = 0xff;
                                                          pubkey.data[0] = 0xff;
                                                          pubkey.data[1] = 0xff;
                                                          pubkey.data[2] = 0xff;
                                                          pubkey.data[3] = 0xff;
                                                          pubkey.data[4] = 0xff;
                                                          pubkey.data[5] = 0xff;
                                                          pubkey.data[6] = 0xff;
                                                          pubkey.data[7] = 0xff;
                                                          pubkey.data[0xc] = 0xff;
                                                          pubkey.data[0xd] = 0xff;
                                                          pubkey.data[0xe] = 0xff;
                                                          pubkey.data[0xf] = 0xff;
                                                          pubkey.data[0x18] = 0xff;
                                                          pubkey.data[0x19] = 0xff;
                                                          pubkey.data[0x1a] = 0xff;
                                                          pubkey.data[0x1b] = 0xff;
                                                          pubkey.data[0x10] = 0xff;
                                                          pubkey.data[0x11] = 0xff;
                                                          pubkey.data[0x12] = 0xff;
                                                          pubkey.data[0x13] = 0xff;
                                                          pubkey.data[0x14] = 0xff;
                                                          pubkey.data[0x15] = 0xff;
                                                          pubkey.data[0x16] = 0xff;
                                                          pubkey.data[0x17] = 0xff;
                                                          pubkey.data[0x1c] = 0xff;
                                                          pubkey.data[0x1d] = 0xff;
                                                          pubkey.data[0x1e] = 0xff;
                                                          pubkey.data[0x1f] = 0xff;
                                                          pubkey.data[0x28] = 0xff;
                                                          pubkey.data[0x29] = 0xff;
                                                          pubkey.data[0x2a] = 0xff;
                                                          pubkey.data[0x2b] = 0xff;
                                                          pubkey.data[0x20] = 0xff;
                                                          pubkey.data[0x21] = 0xff;
                                                          pubkey.data[0x22] = 0xff;
                                                          pubkey.data[0x23] = 0xff;
                                                          pubkey.data[0x24] = 0xff;
                                                          pubkey.data[0x25] = 0xff;
                                                          pubkey.data[0x26] = 0xff;
                                                          pubkey.data[0x27] = 0xff;
                                                          pubkey.data[0x2c] = 0xff;
                                                          pubkey.data[0x2d] = 0xff;
                                                          pubkey.data[0x2e] = 0xff;
                                                          pubkey.data[0x2f] = 0xff;
                                                          pubkey.data[0x38] = 0xff;
                                                          pubkey.data[0x39] = 0xff;
                                                          pubkey.data[0x3a] = 0xff;
                                                          pubkey.data[0x3b] = 0xff;
                                                          pubkey.data[0x30] = 0xff;
                                                          pubkey.data[0x31] = 0xff;
                                                          pubkey.data[0x32] = 0xff;
                                                          pubkey.data[0x33] = 0xff;
                                                          pubkey.data[0x34] = 0xff;
                                                          pubkey.data[0x35] = 0xff;
                                                          pubkey.data[0x36] = 0xff;
                                                          pubkey.data[0x37] = 0xff;
                                                          pubkey.data[0x3c] = 0xff;
                                                          pubkey.data[0x3d] = 0xff;
                                                          pubkey.data[0x3e] = 0xff;
                                                          pubkey.data[0x3f] = 0xff;
                                                          _zzq_result_21 = 0;
                                                          pubkeys[2] = &pubkey_one;
                                                          iVar8 = secp256k1_ec_pubkey_combine
                                                                            (CTX,&pubkey,pubkeys,3);
                                                          if (iVar8 == 0) {
                                                            pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 3) == 1"
                                                  ;
                                                  uVar9 = 0x184e;
                                                  }
                                                  else {
                                                    _zzq_result_21 = 0;
                                                    iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40)
                                                    ;
                                                    if (iVar8 < 1) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
                                                  ;
                                                  uVar9 = 0x1850;
                                                  }
                                                  else {
                                                    len = 0x21;
                                                    iVar8 = secp256k1_ec_pubkey_serialize
                                                                      (CTX,ctmp,&len,&pubkey,0x102);
                                                    if (iVar8 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1"
                                                  ;
                                                  uVar9 = 0x1852;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_ec_pubkey_serialize
                                                                      (CTX,ctmp2,&len,&pubkey_one,
                                                                       0x102);
                                                    if (iVar8 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_one, SECP256K1_EC_COMPRESSED) == 1"
                                                  ;
                                                  uVar9 = 0x1853;
                                                  }
                                                  else {
                                                    iVar8 = secp256k1_memcmp_var(ctmp,ctmp2,0x21);
                                                    if (iVar8 == 0) {
                                                      pubkey.data[8] = 0xff;
                                                      pubkey.data[9] = 0xff;
                                                      pubkey.data[10] = 0xff;
                                                      pubkey.data[0xb] = 0xff;
                                                      pubkey.data[0] = 0xff;
                                                      pubkey.data[1] = 0xff;
                                                      pubkey.data[2] = 0xff;
                                                      pubkey.data[3] = 0xff;
                                                      pubkey.data[4] = 0xff;
                                                      pubkey.data[5] = 0xff;
                                                      pubkey.data[6] = 0xff;
                                                      pubkey.data[7] = 0xff;
                                                      pubkey.data[0xc] = 0xff;
                                                      pubkey.data[0xd] = 0xff;
                                                      pubkey.data[0xe] = 0xff;
                                                      pubkey.data[0xf] = 0xff;
                                                      pubkey.data[0x18] = 0xff;
                                                      pubkey.data[0x19] = 0xff;
                                                      pubkey.data[0x1a] = 0xff;
                                                      pubkey.data[0x1b] = 0xff;
                                                      pubkey.data[0x10] = 0xff;
                                                      pubkey.data[0x11] = 0xff;
                                                      pubkey.data[0x12] = 0xff;
                                                      pubkey.data[0x13] = 0xff;
                                                      pubkey.data[0x14] = 0xff;
                                                      pubkey.data[0x15] = 0xff;
                                                      pubkey.data[0x16] = 0xff;
                                                      pubkey.data[0x17] = 0xff;
                                                      pubkey.data[0x1c] = 0xff;
                                                      pubkey.data[0x1d] = 0xff;
                                                      pubkey.data[0x1e] = 0xff;
                                                      pubkey.data[0x1f] = 0xff;
                                                      pubkey.data[0x28] = 0xff;
                                                      pubkey.data[0x29] = 0xff;
                                                      pubkey.data[0x2a] = 0xff;
                                                      pubkey.data[0x2b] = 0xff;
                                                      pubkey.data[0x20] = 0xff;
                                                      pubkey.data[0x21] = 0xff;
                                                      pubkey.data[0x22] = 0xff;
                                                      pubkey.data[0x23] = 0xff;
                                                      pubkey.data[0x24] = 0xff;
                                                      pubkey.data[0x25] = 0xff;
                                                      pubkey.data[0x26] = 0xff;
                                                      pubkey.data[0x27] = 0xff;
                                                      pubkey.data[0x2c] = 0xff;
                                                      pubkey.data[0x2d] = 0xff;
                                                      pubkey.data[0x2e] = 0xff;
                                                      pubkey.data[0x2f] = 0xff;
                                                      pubkey.data[0x38] = 0xff;
                                                      pubkey.data[0x39] = 0xff;
                                                      pubkey.data[0x3a] = 0xff;
                                                      pubkey.data[0x3b] = 0xff;
                                                      pubkey.data[0x30] = 0xff;
                                                      pubkey.data[0x31] = 0xff;
                                                      pubkey.data[0x32] = 0xff;
                                                      pubkey.data[0x33] = 0xff;
                                                      pubkey.data[0x34] = 0xff;
                                                      pubkey.data[0x35] = 0xff;
                                                      pubkey.data[0x36] = 0xff;
                                                      pubkey.data[0x37] = 0xff;
                                                      pubkey.data[0x3c] = 0xff;
                                                      pubkey.data[0x3d] = 0xff;
                                                      pubkey.data[0x3e] = 0xff;
                                                      pubkey.data[0x3f] = 0xff;
                                                      _zzq_result_21 = 0;
                                                      pubkeys[1] = &pubkey_one;
                                                      iVar8 = secp256k1_ec_pubkey_combine
                                                                        (CTX,&pubkey,pubkeys,2);
                                                      if (iVar8 == 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 1"
                                                  ;
                                                  uVar9 = 0x1859;
                                                  }
                                                  else {
                                                    _zzq_result_21 = 0;
                                                    iVar8 = secp256k1_memcmp_var(&pubkey,zeros,0x40)
                                                    ;
                                                    if (0 < iVar8) {
                                                      return;
                                                    }
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
                                                  ;
                                                  uVar9 = 0x185b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0"
                                                  ;
                                                  uVar9 = 0x1854;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1849;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 0"
                                                  ;
                                                  uVar9 = 0x1847;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0"
                                                  ;
                                                  uVar9 = 0x1841;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1837;
                                                  }
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_combine(CTX, &pubkey, ((void*)0), 1)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1835;
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1832;
                                                  }
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_combine(CTX, ((void*)0), pubkeys, 1)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1831;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 0)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x182e;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_create(CTX, &pubkey, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1825;
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x1823;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x1822;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x1821;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x181e;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x181d;
                                                  }
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x181b;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_tweak_mul(CTX, ((void*)0), ctmp2)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x181a;
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x1817;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x1816;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar9 = 0x1813;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey2, zeros, sizeof(pubkey2)) == 0"
                                                  ;
                                                  uVar9 = 0x1810;
                                                  }
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x180f;
                                                  goto LAB_0011f2a2;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x180b;
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1808;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x1803;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(ctmp2, zeros, 31) == 0 && ctmp2[31] == 1"
                                                  ;
                                                  uVar9 = 0x17fe;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x17f9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 0"
                                                  ;
                                                  uVar9 = 0x17f8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros, ctmp2, 32) == 0"
                                                  ;
                                                  uVar9 = 0x17f6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 0"
                                                  ;
                                                  uVar9 = 0x17f5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x17ec;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, orderc) == 0"
                                                  ;
                                                  uVar9 = 0x17eb;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x17e9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, orderc) == 0"
                                                  ;
                                                  uVar9 = 0x17e8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0"
                                                  ;
                                                  uVar9 = 0x17e3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_tweak_mul(CTX, ctmp, orderc) == 0"
                                                  ;
                                                  uVar9 = 0x17e2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0"
                                                  ;
                                                  uVar9 = 0x17df;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp, orderc) == 0"
                                                  ;
                                                  uVar9 = 0x17de;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0"
                                                  ;
                                                  uVar9 = 0x17d9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0"
                                                  ;
                                                  uVar9 = 0x17d8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0"
                                                  ;
                                                  uVar9 = 0x17d6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 0"
                                                  ;
                                                  uVar9 = 0x17d5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0"
                                                  ;
                                                  uVar9 = 0x17d4;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0"
                                                  ;
                                                  uVar9 = 0x17cc;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp2) == 0"
                                                  ;
                                                  uVar9 = 0x17cb;
                                                  }
                                                }
                                                else {
                                                  pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0"
                                                  ;
                                                  uVar9 = 0x17ca;
                                                }
                                              }
                                              else {
                                                pcVar10 = 
                                                "test condition failed: secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0"
                                                ;
                                                uVar9 = 0x17c9;
                                              }
                                            }
                                            else {
                                              pcVar10 = 
                                              "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0"
                                              ;
                                              uVar9 = 0x17c7;
                                            }
                                          }
                                        }
                                        else {
                                          pcVar10 = 
                                          "test condition failed: secp256k1_memcmp_var(orderc, ctmp, 31) == 0 && ctmp[31] == 0x40"
                                          ;
                                          uVar9 = 0x17c4;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                pcVar10 = 
                                "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                                ;
                                uVar9 = 0x17b7;
                              }
                            }
                            else {
                              pcVar10 = 
                              "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0"
                              ;
                              uVar9 = 0x17b5;
                            }
                          }
                          else {
                            pcVar10 = 
                            "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0";
                            uVar9 = 0x17b2;
                          }
                        }
                      }
                    }
                  }
                  else {
                    pcVar10 = 
                    "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
                    ;
                    uVar9 = 0x17a5;
                  }
                }
                else {
                  pcVar10 = 
                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0";
                  uVar9 = 0x17a3;
                }
              }
              else {
                pcVar10 = "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0";
                uVar9 = 0x17a0;
              }
            }
            else {
              pcVar10 = 
              "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
              ;
              uVar9 = 0x179d;
            }
          }
          else {
            pcVar10 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0";
            uVar9 = 0x179b;
          }
        }
        else {
          pcVar10 = "test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0";
          uVar9 = 0x1798;
        }
      }
      else {
        pcVar10 = 
        "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
        ;
        uVar9 = 0x1795;
      }
    }
    else {
      pcVar10 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, orderc) == 0";
      uVar9 = 0x1793;
    }
  }
  else {
    pcVar10 = "test condition failed: secp256k1_ec_seckey_verify(CTX, orderc) == 0";
    uVar9 = 0x1791;
  }
LAB_0011f2a2:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar9,pcVar10);
  abort();
}

Assistant:

static void run_eckey_edge_case_test(void) {
    const unsigned char orderc[32] = {
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
        0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
        0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41
    };
    const unsigned char zeros[sizeof(secp256k1_pubkey)] = {0x00};
    unsigned char ctmp[33];
    unsigned char ctmp2[33];
    secp256k1_pubkey pubkey;
    secp256k1_pubkey pubkey2;
    secp256k1_pubkey pubkey_one;
    secp256k1_pubkey pubkey_negone;
    const secp256k1_pubkey *pubkeys[3];
    size_t len;
    /* Group order is too large, reject. */
    CHECK(secp256k1_ec_seckey_verify(CTX, orderc) == 0);
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, orderc) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Maximum value is too large, reject. */
    memset(ctmp, 255, 32);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Zero is too small, reject. */
    memset(ctmp, 0, 32);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* One must be accepted. */
    ctmp[31] = 0x01;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    memset(&pubkey, 0, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    pubkey_one = pubkey;
    /* Group order + 1 is too large, reject. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x42;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* -1 must be accepted. */
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    memset(&pubkey, 0, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    pubkey_negone = pubkey;
    /* Tweak of zero leaves the value unchanged. */
    memset(ctmp2, 0, 32);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(orderc, ctmp, 31) == 0 && ctmp[31] == 0x40);
    memcpy(&pubkey2, &pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Multiply tweak of zero zeroizes the output. */
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* If seckey_tweak_add or seckey_tweak_mul are called with an overflowing
    seckey, the seckey is zeroized. */
    memcpy(ctmp, orderc, 32);
    memset(ctmp2, 0, 32);
    ctmp2[31] = 0x01;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp2) == 1);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    /* If seckey_tweak_add or seckey_tweak_mul are called with an overflowing
    tweak, the seckey is zeroized. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, orderc) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, orderc) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    /* If pubkey_tweak_add or pubkey_tweak_mul are called with an overflowing
    tweak, the pubkey is zeroized. */
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, orderc) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, orderc) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* If the resulting key in secp256k1_ec_seckey_tweak_add and
     * secp256k1_ec_pubkey_tweak_add is 0 the functions fail and in the latter
     * case the pubkey is zeroized. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    memset(ctmp2, 0, 32);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp2, 32) == 0);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* Tweak computation wraps and results in a key of 1. */
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 1);
    CHECK(secp256k1_memcmp_var(ctmp2, zeros, 31) == 0 && ctmp2[31] == 1);
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Tweak mul * 2 = 1+1. */
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Zeroize pubkey on parse error. */
    memset(&pubkey, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    memset(&pubkey2, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2));
    CHECK(secp256k1_memcmp_var(&pubkey2, zeros, sizeof(pubkey2)) == 0);
    /* Plain argument errors. */
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_verify(CTX, NULL));
    memset(ctmp2, 0, 32);
    ctmp2[31] = 4;
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_add(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, NULL));
    memset(ctmp2, 0, 32);
    ctmp2[31] = 4;
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_mul(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, NULL));
    memset(ctmp2, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_add(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_add(CTX, ctmp, NULL));
    memset(ctmp2, 0, 32);
    ctmp2[31] = 1;
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_mul(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_mul(CTX, ctmp, NULL));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, NULL, ctmp));
    memset(&pubkey, 1, sizeof(pubkey));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* secp256k1_ec_pubkey_combine tests. */
    pubkeys[0] = &pubkey_one;
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[0], sizeof(secp256k1_pubkey *));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[1], sizeof(secp256k1_pubkey *));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[2], sizeof(secp256k1_pubkey *));
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 0));
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_combine(CTX, NULL, pubkeys, 1));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_combine(CTX, &pubkey, NULL, 1));
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    pubkeys[0] = &pubkey_negone;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 1) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    len = 33;
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_negone, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0);
    /* Result is infinity. */
    pubkeys[0] = &pubkey_one;
    pubkeys[1] = &pubkey_negone;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Passes through infinity but comes out one. */
    pubkeys[2] = &pubkey_one;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 3) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    len = 33;
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_one, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0);
    /* Adds to two. */
    pubkeys[1] = &pubkey_one;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
}